

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_inv_txfm_sse4.c
# Opt level: O1

void iadst16x16_low8_sse4_1(__m128i *in,__m128i *out,int bit,int do_cols,int bd,int out_shift)

{
  undefined4 uVar1;
  long lVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int iVar11;
  int iVar12;
  int iVar13;
  int iVar14;
  int iVar15;
  int iVar16;
  int iVar17;
  int iVar18;
  int iVar19;
  int iVar20;
  int iVar21;
  int iVar22;
  undefined1 auVar10 [16];
  int iVar23;
  int iVar24;
  int iVar25;
  int iVar26;
  int iVar27;
  int iVar28;
  int iVar29;
  int iVar30;
  int iVar34;
  int iVar35;
  int iVar36;
  undefined1 auVar31 [16];
  undefined1 auVar32 [16];
  undefined1 auVar33 [16];
  uint uVar37;
  uint uVar40;
  uint uVar41;
  undefined1 auVar38 [16];
  undefined1 auVar39 [16];
  uint uVar42;
  uint uVar43;
  int iVar49;
  int iVar51;
  __m128i offset;
  undefined1 auVar44 [16];
  undefined1 auVar45 [16];
  int iVar53;
  undefined1 auVar46 [16];
  undefined1 auVar47 [16];
  uint uVar50;
  uint uVar52;
  uint uVar54;
  undefined1 auVar48 [16];
  uint uVar55;
  uint uVar56;
  uint uVar60;
  uint uVar61;
  uint uVar62;
  uint uVar63;
  undefined1 auVar57 [16];
  undefined1 auVar58 [16];
  undefined1 auVar59 [16];
  uint uVar64;
  uint uVar65;
  uint uVar66;
  uint uVar68;
  uint uVar69;
  undefined1 auVar67 [16];
  uint uVar70;
  int iVar71;
  uint uVar72;
  int iVar77;
  uint uVar78;
  int iVar79;
  uint uVar80;
  undefined1 auVar73 [16];
  int iVar81;
  undefined1 auVar74 [16];
  undefined1 auVar75 [16];
  undefined1 auVar76 [16];
  uint uVar82;
  int iVar83;
  uint uVar84;
  int iVar88;
  int iVar90;
  undefined1 auVar85 [16];
  int iVar92;
  undefined1 auVar86 [16];
  uint uVar89;
  uint uVar91;
  uint uVar93;
  undefined1 auVar87 [16];
  int iVar94;
  uint uVar95;
  int iVar101;
  int iVar103;
  undefined1 auVar96 [16];
  int iVar105;
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  uint uVar102;
  uint uVar104;
  uint uVar106;
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  int iVar107;
  int iVar108;
  int iVar110;
  int iVar111;
  int iVar112;
  int iVar113;
  undefined1 auVar109 [16];
  int iVar114;
  int iVar115;
  int iVar116;
  uint uVar117;
  int iVar120;
  uint uVar121;
  int iVar122;
  uint uVar123;
  undefined1 auVar118 [16];
  int iVar124;
  undefined1 auVar119 [16];
  uint uVar125;
  int iVar126;
  int iVar129;
  int iVar130;
  undefined1 auVar127 [16];
  int iVar131;
  undefined1 auVar128 [16];
  int iVar132;
  uint uVar133;
  int iVar138;
  int iVar140;
  undefined1 auVar134 [16];
  int iVar142;
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  uint uVar139;
  uint uVar141;
  uint uVar143;
  undefined1 auVar137 [16];
  int iVar144;
  uint uVar145;
  uint uVar146;
  int iVar151;
  uint uVar153;
  int iVar154;
  uint uVar156;
  undefined1 auVar147 [16];
  uint uVar152;
  uint uVar155;
  int iVar157;
  uint uVar158;
  undefined1 auVar148 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  uint uVar159;
  int iVar160;
  uint uVar162;
  uint uVar163;
  int iVar170;
  int iVar174;
  undefined1 auVar164 [16];
  int iVar178;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  uint uVar161;
  uint uVar171;
  uint uVar175;
  uint uVar179;
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  uint uVar172;
  uint uVar173;
  uint uVar176;
  uint uVar177;
  uint uVar180;
  uint uVar181;
  undefined1 auVar169 [16];
  uint uVar182;
  int iVar187;
  int iVar189;
  undefined1 auVar183 [16];
  int iVar191;
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  uint uVar188;
  uint uVar190;
  uint uVar192;
  undefined1 auVar186 [16];
  int local_108;
  int iStack_104;
  int iStack_100;
  int iStack_fc;
  undefined8 local_f8;
  undefined8 uStack_f0;
  int local_d8;
  int iStack_d4;
  int iStack_d0;
  int iStack_cc;
  
  lVar2 = (long)bit * 0x100;
  iVar3 = 1 << ((char)bit - 1U & 0x1f);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x168);
  auVar73._4_4_ = uVar1;
  auVar73._0_4_ = uVar1;
  auVar73._8_4_ = uVar1;
  auVar73._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 600);
  auVar118._4_4_ = uVar1;
  auVar118._0_4_ = uVar1;
  auVar118._8_4_ = uVar1;
  auVar118._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x188);
  auVar67._4_4_ = uVar1;
  auVar67._0_4_ = uVar1;
  auVar67._8_4_ = uVar1;
  auVar67._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x238);
  auVar164._4_4_ = uVar1;
  auVar164._0_4_ = uVar1;
  auVar164._8_4_ = uVar1;
  auVar164._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x1a8);
  auVar57._4_4_ = uVar1;
  auVar57._0_4_ = uVar1;
  auVar57._8_4_ = uVar1;
  auVar57._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x218);
  auVar96._4_4_ = uVar1;
  auVar96._0_4_ = uVar1;
  auVar96._8_4_ = uVar1;
  auVar96._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x1c8);
  auVar10._4_4_ = uVar1;
  auVar10._0_4_ = uVar1;
  auVar10._8_4_ = uVar1;
  auVar10._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x1f8);
  auVar85._4_4_ = uVar1;
  auVar85._0_4_ = uVar1;
  auVar85._8_4_ = uVar1;
  auVar85._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x1e8);
  auVar134._4_4_ = uVar1;
  auVar134._0_4_ = uVar1;
  auVar134._8_4_ = uVar1;
  auVar134._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x1d8);
  auVar109._4_4_ = uVar1;
  auVar109._0_4_ = uVar1;
  auVar109._8_4_ = uVar1;
  auVar109._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x208);
  auVar127._4_4_ = uVar1;
  auVar127._0_4_ = uVar1;
  auVar127._8_4_ = uVar1;
  auVar127._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x1b8);
  auVar58._4_4_ = uVar1;
  auVar58._0_4_ = uVar1;
  auVar58._8_4_ = uVar1;
  auVar58._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x228);
  auVar183._4_4_ = uVar1;
  auVar183._0_4_ = uVar1;
  auVar183._8_4_ = uVar1;
  auVar183._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x198);
  auVar44._4_4_ = uVar1;
  auVar44._0_4_ = uVar1;
  auVar44._8_4_ = uVar1;
  auVar44._12_4_ = uVar1;
  auVar147 = pmulld(auVar118,(undefined1  [16])*in);
  auVar118 = pmulld(auVar73,(undefined1  [16])*in);
  auVar164 = pmulld(auVar164,(undefined1  [16])in[2]);
  auVar73 = pmulld(auVar67,(undefined1  [16])in[2]);
  auVar96 = pmulld(auVar96,(undefined1  [16])in[4]);
  auVar57 = pmulld(auVar57,(undefined1  [16])in[4]);
  auVar85 = pmulld(auVar85,(undefined1  [16])in[6]);
  auVar10 = pmulld(auVar10,(undefined1  [16])in[6]);
  auVar134 = pmulld(auVar134,(undefined1  [16])in[7]);
  auVar109 = pmulld(auVar109,(undefined1  [16])in[7]);
  auVar127 = pmulld(auVar127,(undefined1  [16])in[5]);
  auVar67 = pmulld(auVar58,(undefined1  [16])in[5]);
  auVar183 = pmulld(auVar183,(undefined1  [16])in[3]);
  auVar44 = pmulld(auVar44,(undefined1  [16])in[3]);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x248);
  auVar184._4_4_ = uVar1;
  auVar184._0_4_ = uVar1;
  auVar184._8_4_ = uVar1;
  auVar184._12_4_ = uVar1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x178);
  auVar45._4_4_ = uVar1;
  auVar45._0_4_ = uVar1;
  auVar45._8_4_ = uVar1;
  auVar45._12_4_ = uVar1;
  auVar58 = ZEXT416((uint)bit);
  iVar144 = auVar147._0_4_ + iVar3 >> auVar58;
  iVar151 = auVar147._4_4_ + iVar3 >> auVar58;
  iVar154 = auVar147._8_4_ + iVar3 >> auVar58;
  iVar157 = auVar147._12_4_ + iVar3 >> auVar58;
  auVar147 = pmulld(auVar184,(undefined1  [16])in[1]);
  auVar45 = pmulld(auVar45,(undefined1  [16])in[1]);
  iVar30 = iVar3 - auVar118._0_4_ >> auVar58;
  iVar34 = iVar3 - auVar118._4_4_ >> auVar58;
  iVar35 = iVar3 - auVar118._8_4_ >> auVar58;
  iVar36 = iVar3 - auVar118._12_4_ >> auVar58;
  iVar132 = auVar134._0_4_ + iVar3 >> auVar58;
  iVar138 = auVar134._4_4_ + iVar3 >> auVar58;
  iVar140 = auVar134._8_4_ + iVar3 >> auVar58;
  iVar142 = auVar134._12_4_ + iVar3 >> auVar58;
  iVar4 = iVar132 + iVar144;
  iVar11 = iVar138 + iVar151;
  iVar17 = iVar140 + iVar154;
  iVar23 = iVar142 + iVar157;
  iVar144 = iVar144 - iVar132;
  iVar151 = iVar151 - iVar138;
  iVar154 = iVar154 - iVar140;
  iVar157 = iVar157 - iVar142;
  iVar132 = auVar109._0_4_ + iVar3 >> auVar58;
  iVar138 = auVar109._4_4_ + iVar3 >> auVar58;
  iVar140 = auVar109._8_4_ + iVar3 >> auVar58;
  iVar142 = auVar109._12_4_ + iVar3 >> auVar58;
  iVar5 = iVar132 + iVar30;
  iVar12 = iVar138 + iVar34;
  iVar18 = iVar140 + iVar35;
  iVar24 = iVar142 + iVar36;
  iVar30 = iVar30 - iVar132;
  iVar34 = iVar34 - iVar138;
  iVar35 = iVar35 - iVar140;
  iVar36 = iVar36 - iVar142;
  local_d8 = auVar164._0_4_;
  iStack_d4 = auVar164._4_4_;
  iStack_d0 = auVar164._8_4_;
  iStack_cc = auVar164._12_4_;
  iVar6 = local_d8 + iVar3 >> auVar58;
  iVar13 = iStack_d4 + iVar3 >> auVar58;
  iVar19 = iStack_d0 + iVar3 >> auVar58;
  iVar25 = iStack_cc + iVar3 >> auVar58;
  iVar160 = iVar3 - auVar73._0_4_ >> auVar58;
  iVar170 = iVar3 - auVar73._4_4_ >> auVar58;
  iVar174 = iVar3 - auVar73._8_4_ >> auVar58;
  iVar178 = iVar3 - auVar73._12_4_ >> auVar58;
  iVar126 = auVar127._0_4_ + iVar3 >> auVar58;
  iVar129 = auVar127._4_4_ + iVar3 >> auVar58;
  iVar130 = auVar127._8_4_ + iVar3 >> auVar58;
  iVar131 = auVar127._12_4_ + iVar3 >> auVar58;
  iVar132 = auVar67._0_4_ + iVar3 >> auVar58;
  iVar138 = auVar67._4_4_ + iVar3 >> auVar58;
  iVar140 = auVar67._8_4_ + iVar3 >> auVar58;
  iVar142 = auVar67._12_4_ + iVar3 >> auVar58;
  iVar7 = iVar126 + iVar6;
  iVar14 = iVar129 + iVar13;
  iVar20 = iVar130 + iVar19;
  iVar26 = iVar131 + iVar25;
  iVar6 = iVar6 - iVar126;
  iVar13 = iVar13 - iVar129;
  iVar19 = iVar19 - iVar130;
  iVar25 = iVar25 - iVar131;
  iVar8 = iVar132 + iVar160;
  iVar15 = iVar138 + iVar170;
  iVar21 = iVar140 + iVar174;
  iVar27 = iVar142 + iVar178;
  iVar160 = iVar160 - iVar132;
  iVar170 = iVar170 - iVar138;
  iVar174 = iVar174 - iVar140;
  iVar178 = iVar178 - iVar142;
  iVar94 = auVar96._0_4_ + iVar3 >> auVar58;
  iVar101 = auVar96._4_4_ + iVar3 >> auVar58;
  iVar103 = auVar96._8_4_ + iVar3 >> auVar58;
  iVar105 = auVar96._12_4_ + iVar3 >> auVar58;
  local_108 = auVar183._0_4_;
  iStack_104 = auVar183._4_4_;
  iStack_100 = auVar183._8_4_;
  iStack_fc = auVar183._12_4_;
  iVar132 = local_108 + iVar3 >> auVar58;
  iVar138 = iStack_104 + iVar3 >> auVar58;
  iVar140 = iStack_100 + iVar3 >> auVar58;
  iVar142 = iStack_fc + iVar3 >> auVar58;
  iVar107 = iVar132 + iVar94;
  iVar110 = iVar138 + iVar101;
  iVar112 = iVar140 + iVar103;
  iVar114 = iVar142 + iVar105;
  iVar94 = iVar94 - iVar132;
  iVar101 = iVar101 - iVar138;
  iVar103 = iVar103 - iVar140;
  iVar105 = iVar105 - iVar142;
  iVar71 = iVar3 - auVar57._0_4_ >> auVar58;
  iVar77 = iVar3 - auVar57._4_4_ >> auVar58;
  iVar79 = iVar3 - auVar57._8_4_ >> auVar58;
  iVar81 = iVar3 - auVar57._12_4_ >> auVar58;
  local_f8._0_4_ = auVar44._0_4_;
  local_f8._4_4_ = auVar44._4_4_;
  uStack_f0._0_4_ = auVar44._8_4_;
  uStack_f0._4_4_ = auVar44._12_4_;
  iVar132 = (int)local_f8 + iVar3 >> auVar58;
  iVar138 = local_f8._4_4_ + iVar3 >> auVar58;
  iVar140 = (int)((uint)uStack_f0 + iVar3) >> auVar58;
  iVar142 = (int)(uStack_f0._4_4_ + iVar3) >> auVar58;
  iVar108 = iVar132 + iVar71;
  iVar111 = iVar138 + iVar77;
  iVar113 = iVar140 + iVar79;
  iVar115 = iVar142 + iVar81;
  iVar71 = iVar71 - iVar132;
  iVar77 = iVar77 - iVar138;
  iVar79 = iVar79 - iVar140;
  iVar81 = iVar81 - iVar142;
  iVar132 = *(int *)((long)vert_filter_length_chroma + lVar2 + 0x240);
  iVar129 = -iVar132;
  iVar138 = *(int *)((long)vert_filter_length_chroma + lVar2 + 0x1c0);
  iVar140 = *(int *)((long)vert_filter_length_chroma + lVar2 + 0x220);
  iVar126 = -iVar138;
  iVar130 = -iVar140;
  iVar131 = bd + 6 + (uint)(do_cols == 0) * 2;
  iVar142 = 0x8000;
  if (0xf < iVar131) {
    iVar142 = 1 << ((char)iVar131 - 1U & 0x1f);
  }
  iVar83 = auVar85._0_4_ + iVar3 >> auVar58;
  iVar88 = auVar85._4_4_ + iVar3 >> auVar58;
  iVar90 = auVar85._8_4_ + iVar3 >> auVar58;
  iVar92 = auVar85._12_4_ + iVar3 >> auVar58;
  iVar131 = auVar147._0_4_ + iVar3 >> auVar58;
  iVar187 = auVar147._4_4_ + iVar3 >> auVar58;
  iVar189 = auVar147._8_4_ + iVar3 >> auVar58;
  iVar191 = auVar147._12_4_ + iVar3 >> auVar58;
  iVar9 = iVar131 + iVar83;
  iVar16 = iVar187 + iVar88;
  iVar22 = iVar189 + iVar90;
  iVar28 = iVar191 + iVar92;
  iVar83 = iVar83 - iVar131;
  iVar88 = iVar88 - iVar187;
  iVar90 = iVar90 - iVar189;
  iVar92 = iVar92 - iVar191;
  iVar116 = iVar3 - auVar10._0_4_ >> auVar58;
  iVar120 = iVar3 - auVar10._4_4_ >> auVar58;
  iVar122 = iVar3 - auVar10._8_4_ >> auVar58;
  iVar124 = iVar3 - auVar10._12_4_ >> auVar58;
  iVar131 = auVar45._0_4_ + iVar3 >> auVar58;
  iVar49 = auVar45._4_4_ + iVar3 >> auVar58;
  iVar51 = auVar45._8_4_ + iVar3 >> auVar58;
  iVar53 = auVar45._12_4_ + iVar3 >> auVar58;
  iVar187 = iVar131 + iVar116;
  iVar189 = iVar49 + iVar120;
  iVar191 = iVar51 + iVar122;
  iVar29 = iVar53 + iVar124;
  iVar116 = iVar116 - iVar131;
  iVar120 = iVar120 - iVar49;
  iVar122 = iVar122 - iVar51;
  iVar124 = iVar124 - iVar53;
  iVar131 = -iVar142;
  iVar142 = iVar142 + -1;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x180);
  auVar46._4_4_ = uVar1;
  auVar46._0_4_ = uVar1;
  auVar46._8_4_ = uVar1;
  auVar46._12_4_ = uVar1;
  auVar135._4_4_ = iVar132;
  auVar135._0_4_ = iVar132;
  auVar135._8_4_ = iVar132;
  auVar135._12_4_ = iVar132;
  uVar145 = (uint)(iVar144 < iVar131) * iVar131 | (uint)(iVar144 >= iVar131) * iVar144;
  uVar152 = (uint)(iVar151 < iVar131) * iVar131 | (uint)(iVar151 >= iVar131) * iVar151;
  uVar155 = (uint)(iVar154 < iVar131) * iVar131 | (uint)(iVar154 >= iVar131) * iVar154;
  uVar158 = (uint)(iVar157 < iVar131) * iVar131 | (uint)(iVar157 >= iVar131) * iVar157;
  auVar148._0_4_ = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  auVar148._4_4_ = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  auVar148._8_4_ = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  auVar148._12_4_ = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  uVar145 = (uint)(iVar30 < iVar131) * iVar131 | (uint)(iVar30 >= iVar131) * iVar30;
  uVar152 = (uint)(iVar34 < iVar131) * iVar131 | (uint)(iVar34 >= iVar131) * iVar34;
  uVar155 = (uint)(iVar35 < iVar131) * iVar131 | (uint)(iVar35 >= iVar131) * iVar35;
  uVar158 = (uint)(iVar36 < iVar131) * iVar131 | (uint)(iVar36 >= iVar131) * iVar36;
  auVar31._0_4_ = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  auVar31._4_4_ = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  auVar31._8_4_ = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  auVar31._12_4_ = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  auVar10 = pmulld(auVar148,auVar135);
  auVar109 = pmulld(auVar135,auVar31);
  auVar127 = pmulld(auVar148,auVar46);
  auVar44 = pmulld(auVar31,auVar46);
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x200);
  auVar136._4_4_ = uVar1;
  auVar136._0_4_ = uVar1;
  auVar136._8_4_ = uVar1;
  auVar136._12_4_ = uVar1;
  auVar32._4_4_ = iVar138;
  auVar32._0_4_ = iVar138;
  auVar32._8_4_ = iVar138;
  auVar32._12_4_ = iVar138;
  uVar145 = (uint)(iVar6 < iVar131) * iVar131 | (uint)(iVar6 >= iVar131) * iVar6;
  uVar152 = (uint)(iVar13 < iVar131) * iVar131 | (uint)(iVar13 >= iVar131) * iVar13;
  uVar155 = (uint)(iVar19 < iVar131) * iVar131 | (uint)(iVar19 >= iVar131) * iVar19;
  uVar158 = (uint)(iVar25 < iVar131) * iVar131 | (uint)(iVar25 >= iVar131) * iVar25;
  auVar149._0_4_ = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  auVar149._4_4_ = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  auVar149._8_4_ = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  auVar149._12_4_ = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  uVar145 = (uint)(iVar160 < iVar131) * iVar131 | (uint)(iVar160 >= iVar131) * iVar160;
  uVar152 = (uint)(iVar170 < iVar131) * iVar131 | (uint)(iVar170 >= iVar131) * iVar170;
  uVar155 = (uint)(iVar174 < iVar131) * iVar131 | (uint)(iVar174 >= iVar131) * iVar174;
  uVar158 = (uint)(iVar178 < iVar131) * iVar131 | (uint)(iVar178 >= iVar131) * iVar178;
  auVar165._0_4_ = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  auVar165._4_4_ = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  auVar165._8_4_ = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  auVar165._12_4_ = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  auVar183 = pmulld(auVar136,auVar165);
  auVar147 = pmulld(auVar165,auVar32);
  auVar45 = pmulld(auVar32,auVar149);
  auVar134 = pmulld(auVar149,auVar136);
  auVar166._4_4_ = iVar129;
  auVar166._0_4_ = iVar129;
  auVar166._8_4_ = iVar129;
  auVar166._12_4_ = iVar129;
  uVar145 = (uint)(iVar94 < iVar131) * iVar131 | (uint)(iVar94 >= iVar131) * iVar94;
  uVar152 = (uint)(iVar101 < iVar131) * iVar131 | (uint)(iVar101 >= iVar131) * iVar101;
  uVar155 = (uint)(iVar103 < iVar131) * iVar131 | (uint)(iVar103 >= iVar131) * iVar103;
  uVar158 = (uint)(iVar105 < iVar131) * iVar131 | (uint)(iVar105 >= iVar131) * iVar105;
  auVar97._0_4_ = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  auVar97._4_4_ = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  auVar97._8_4_ = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  auVar97._12_4_ = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  uVar145 = (uint)(iVar71 < iVar131) * iVar131 | (uint)(iVar71 >= iVar131) * iVar71;
  uVar152 = (uint)(iVar77 < iVar131) * iVar131 | (uint)(iVar77 >= iVar131) * iVar77;
  uVar155 = (uint)(iVar79 < iVar131) * iVar131 | (uint)(iVar79 >= iVar131) * iVar79;
  uVar158 = (uint)(iVar81 < iVar131) * iVar131 | (uint)(iVar81 >= iVar131) * iVar81;
  auVar74._0_4_ = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  auVar74._4_4_ = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  auVar74._8_4_ = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  auVar74._12_4_ = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  auVar184 = pmulld(auVar74,auVar46);
  auVar57 = pmulld(auVar46,auVar97);
  auVar85 = pmulld(auVar97,auVar166);
  auVar67 = pmulld(auVar74,auVar166);
  auVar75._4_4_ = iVar126;
  auVar75._0_4_ = iVar126;
  auVar75._8_4_ = iVar126;
  auVar75._12_4_ = iVar126;
  uVar145 = (uint)(iVar83 < iVar131) * iVar131 | (uint)(iVar83 >= iVar131) * iVar83;
  uVar152 = (uint)(iVar88 < iVar131) * iVar131 | (uint)(iVar88 >= iVar131) * iVar88;
  uVar155 = (uint)(iVar90 < iVar131) * iVar131 | (uint)(iVar90 >= iVar131) * iVar90;
  uVar158 = (uint)(iVar92 < iVar131) * iVar131 | (uint)(iVar92 >= iVar131) * iVar92;
  auVar86._0_4_ = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  auVar86._4_4_ = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  auVar86._8_4_ = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  auVar86._12_4_ = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  uVar145 = (uint)(iVar116 < iVar131) * iVar131 | (uint)(iVar116 >= iVar131) * iVar116;
  uVar152 = (uint)(iVar120 < iVar131) * iVar131 | (uint)(iVar120 >= iVar131) * iVar120;
  uVar155 = (uint)(iVar122 < iVar131) * iVar131 | (uint)(iVar122 >= iVar131) * iVar122;
  uVar158 = (uint)(iVar124 < iVar131) * iVar131 | (uint)(iVar124 >= iVar131) * iVar124;
  auVar119._0_4_ = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  auVar119._4_4_ = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  auVar119._8_4_ = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  auVar119._12_4_ = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  auVar164 = pmulld(auVar119,auVar136);
  auVar118 = pmulld(auVar136,auVar86);
  auVar73 = pmulld(auVar86,auVar75);
  auVar96 = pmulld(auVar119,auVar75);
  uVar145 = (uint)(iVar4 < iVar131) * iVar131 | (uint)(iVar4 >= iVar131) * iVar4;
  uVar152 = (uint)(iVar11 < iVar131) * iVar131 | (uint)(iVar11 >= iVar131) * iVar11;
  uVar155 = (uint)(iVar17 < iVar131) * iVar131 | (uint)(iVar17 >= iVar131) * iVar17;
  uVar158 = (uint)(iVar23 < iVar131) * iVar131 | (uint)(iVar23 >= iVar131) * iVar23;
  uVar161 = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  uVar171 = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  uVar175 = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  uVar179 = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  uVar145 = (uint)(iVar107 < iVar131) * iVar131 | (uint)(iVar107 >= iVar131) * iVar107;
  uVar152 = (uint)(iVar110 < iVar131) * iVar131 | (uint)(iVar110 >= iVar131) * iVar110;
  uVar155 = (uint)(iVar112 < iVar131) * iVar131 | (uint)(iVar112 >= iVar131) * iVar112;
  uVar158 = (uint)(iVar114 < iVar131) * iVar131 | (uint)(iVar114 >= iVar131) * iVar114;
  uVar145 = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  uVar152 = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  uVar155 = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  uVar158 = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  iVar11 = uVar145 + uVar161;
  iVar13 = uVar152 + uVar171;
  iVar19 = uVar155 + uVar175;
  iVar23 = uVar158 + uVar179;
  iVar49 = uVar161 - uVar145;
  iVar51 = uVar171 - uVar152;
  iVar53 = uVar175 - uVar155;
  iVar83 = uVar179 - uVar158;
  uVar145 = (uint)(iVar5 < iVar131) * iVar131 | (uint)(iVar5 >= iVar131) * iVar5;
  uVar152 = (uint)(iVar12 < iVar131) * iVar131 | (uint)(iVar12 >= iVar131) * iVar12;
  uVar155 = (uint)(iVar18 < iVar131) * iVar131 | (uint)(iVar18 >= iVar131) * iVar18;
  uVar158 = (uint)(iVar24 < iVar131) * iVar131 | (uint)(iVar24 >= iVar131) * iVar24;
  uVar145 = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  uVar152 = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  uVar155 = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  uVar158 = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  uVar161 = (uint)(iVar108 < iVar131) * iVar131 | (uint)(iVar108 >= iVar131) * iVar108;
  uVar171 = (uint)(iVar111 < iVar131) * iVar131 | (uint)(iVar111 >= iVar131) * iVar111;
  uVar175 = (uint)(iVar113 < iVar131) * iVar131 | (uint)(iVar113 >= iVar131) * iVar113;
  uVar179 = (uint)(iVar115 < iVar131) * iVar131 | (uint)(iVar115 >= iVar131) * iVar115;
  uVar161 = (uint)(iVar142 < (int)uVar161) * iVar142 | (iVar142 >= (int)uVar161) * uVar161;
  uVar171 = (uint)(iVar142 < (int)uVar171) * iVar142 | (iVar142 >= (int)uVar171) * uVar171;
  uVar175 = (uint)(iVar142 < (int)uVar175) * iVar142 | (iVar142 >= (int)uVar175) * uVar175;
  uVar179 = (uint)(iVar142 < (int)uVar179) * iVar142 | (iVar142 >= (int)uVar179) * uVar179;
  iVar103 = uVar161 + uVar145;
  iVar107 = uVar171 + uVar152;
  iVar110 = uVar175 + uVar155;
  iVar115 = uVar179 + uVar158;
  iVar12 = uVar145 - uVar161;
  iVar17 = uVar152 - uVar171;
  iVar18 = uVar155 - uVar175;
  iVar24 = uVar158 - uVar179;
  uVar145 = (uint)(iVar7 < iVar131) * iVar131 | (uint)(iVar7 >= iVar131) * iVar7;
  uVar152 = (uint)(iVar14 < iVar131) * iVar131 | (uint)(iVar14 >= iVar131) * iVar14;
  uVar155 = (uint)(iVar20 < iVar131) * iVar131 | (uint)(iVar20 >= iVar131) * iVar20;
  uVar158 = (uint)(iVar26 < iVar131) * iVar131 | (uint)(iVar26 >= iVar131) * iVar26;
  uVar145 = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  uVar152 = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  uVar155 = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  uVar158 = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  uVar161 = (uint)(iVar9 < iVar131) * iVar131 | (uint)(iVar9 >= iVar131) * iVar9;
  uVar171 = (uint)(iVar16 < iVar131) * iVar131 | (uint)(iVar16 >= iVar131) * iVar16;
  uVar175 = (uint)(iVar22 < iVar131) * iVar131 | (uint)(iVar22 >= iVar131) * iVar22;
  uVar179 = (uint)(iVar28 < iVar131) * iVar131 | (uint)(iVar28 >= iVar131) * iVar28;
  uVar161 = (uint)(iVar142 < (int)uVar161) * iVar142 | (iVar142 >= (int)uVar161) * uVar161;
  uVar171 = (uint)(iVar142 < (int)uVar171) * iVar142 | (iVar142 >= (int)uVar171) * uVar171;
  uVar175 = (uint)(iVar142 < (int)uVar175) * iVar142 | (iVar142 >= (int)uVar175) * uVar175;
  uVar179 = (uint)(iVar142 < (int)uVar179) * iVar142 | (iVar142 >= (int)uVar179) * uVar179;
  iVar81 = uVar161 + uVar145;
  iVar101 = uVar171 + uVar152;
  iVar112 = uVar175 + uVar155;
  iVar151 = uVar179 + uVar158;
  iVar9 = uVar145 - uVar161;
  iVar16 = uVar152 - uVar171;
  iVar22 = uVar155 - uVar175;
  iVar28 = uVar158 - uVar179;
  uVar145 = (uint)(iVar8 < iVar131) * iVar131 | (uint)(iVar8 >= iVar131) * iVar8;
  uVar152 = (uint)(iVar15 < iVar131) * iVar131 | (uint)(iVar15 >= iVar131) * iVar15;
  uVar155 = (uint)(iVar21 < iVar131) * iVar131 | (uint)(iVar21 >= iVar131) * iVar21;
  uVar158 = (uint)(iVar27 < iVar131) * iVar131 | (uint)(iVar27 >= iVar131) * iVar27;
  uVar161 = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  uVar171 = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  uVar175 = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  uVar179 = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  uVar145 = (uint)(iVar187 < iVar131) * iVar131 | (uint)(iVar187 >= iVar131) * iVar187;
  uVar152 = (uint)(iVar189 < iVar131) * iVar131 | (uint)(iVar189 >= iVar131) * iVar189;
  uVar155 = (uint)(iVar191 < iVar131) * iVar131 | (uint)(iVar191 >= iVar131) * iVar191;
  uVar158 = (uint)(iVar29 < iVar131) * iVar131 | (uint)(iVar29 >= iVar131) * iVar29;
  uVar145 = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  uVar152 = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  uVar155 = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  uVar158 = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  iVar88 = uVar145 + uVar161;
  iVar90 = uVar152 + uVar171;
  iVar92 = uVar155 + uVar175;
  iVar116 = uVar158 + uVar179;
  iVar187 = uVar161 - uVar145;
  iVar189 = uVar171 - uVar152;
  iVar191 = uVar175 - uVar155;
  iVar29 = uVar179 - uVar158;
  iVar21 = auVar127._0_4_ + iVar3 + auVar109._0_4_ >> auVar58;
  iVar25 = auVar127._4_4_ + iVar3 + auVar109._4_4_ >> auVar58;
  iVar36 = auVar127._8_4_ + iVar3 + auVar109._8_4_ >> auVar58;
  iVar77 = auVar127._12_4_ + iVar3 + auVar109._12_4_ >> auVar58;
  iVar132 = (auVar10._0_4_ + iVar3) - auVar44._0_4_ >> auVar58;
  iVar138 = (auVar10._4_4_ + iVar3) - auVar44._4_4_ >> auVar58;
  iVar126 = (auVar10._8_4_ + iVar3) - auVar44._8_4_ >> auVar58;
  iVar129 = (auVar10._12_4_ + iVar3) - auVar44._12_4_ >> auVar58;
  iVar4 = auVar85._0_4_ + iVar3 + auVar184._0_4_ >> auVar58;
  iVar5 = auVar85._4_4_ + iVar3 + auVar184._4_4_ >> auVar58;
  iVar6 = auVar85._8_4_ + iVar3 + auVar184._8_4_ >> auVar58;
  iVar7 = auVar85._12_4_ + iVar3 + auVar184._12_4_ >> auVar58;
  iVar114 = iVar4 + iVar21;
  iVar144 = iVar5 + iVar25;
  iVar154 = iVar6 + iVar36;
  iVar160 = iVar7 + iVar77;
  iVar21 = iVar21 - iVar4;
  iVar25 = iVar25 - iVar5;
  iVar36 = iVar36 - iVar6;
  iVar77 = iVar77 - iVar7;
  iVar4 = (auVar57._0_4_ + iVar3) - auVar67._0_4_ >> auVar58;
  iVar5 = (auVar57._4_4_ + iVar3) - auVar67._4_4_ >> auVar58;
  iVar6 = (auVar57._8_4_ + iVar3) - auVar67._8_4_ >> auVar58;
  iVar7 = (auVar57._12_4_ + iVar3) - auVar67._12_4_ >> auVar58;
  iVar105 = iVar4 + iVar132;
  iVar108 = iVar5 + iVar138;
  iVar111 = iVar6 + iVar126;
  iVar113 = iVar7 + iVar129;
  iVar132 = iVar132 - iVar4;
  iVar138 = iVar138 - iVar5;
  iVar126 = iVar126 - iVar6;
  iVar129 = iVar129 - iVar7;
  iVar8 = auVar134._0_4_ + iVar3 + auVar147._0_4_ >> auVar58;
  iVar14 = auVar134._4_4_ + iVar3 + auVar147._4_4_ >> auVar58;
  iVar15 = auVar134._8_4_ + iVar3 + auVar147._8_4_ >> auVar58;
  iVar20 = auVar134._12_4_ + iVar3 + auVar147._12_4_ >> auVar58;
  iVar4 = (auVar45._0_4_ + iVar3) - auVar183._0_4_ >> auVar58;
  iVar5 = (auVar45._4_4_ + iVar3) - auVar183._4_4_ >> auVar58;
  iVar6 = (auVar45._8_4_ + iVar3) - auVar183._8_4_ >> auVar58;
  iVar7 = (auVar45._12_4_ + iVar3) - auVar183._12_4_ >> auVar58;
  iVar26 = auVar73._0_4_ + iVar3 + auVar164._0_4_ >> auVar58;
  iVar27 = auVar73._4_4_ + iVar3 + auVar164._4_4_ >> auVar58;
  iVar30 = auVar73._8_4_ + iVar3 + auVar164._8_4_ >> auVar58;
  iVar34 = auVar73._12_4_ + iVar3 + auVar164._12_4_ >> auVar58;
  iVar157 = (auVar118._0_4_ + iVar3) - auVar96._0_4_ >> auVar58;
  iVar170 = (auVar118._4_4_ + iVar3) - auVar96._4_4_ >> auVar58;
  iVar174 = (auVar118._8_4_ + iVar3) - auVar96._8_4_ >> auVar58;
  iVar178 = (auVar118._12_4_ + iVar3) - auVar96._12_4_ >> auVar58;
  iVar35 = iVar26 + iVar8;
  iVar71 = iVar27 + iVar14;
  iVar79 = iVar30 + iVar15;
  iVar94 = iVar34 + iVar20;
  iVar8 = iVar8 - iVar26;
  iVar14 = iVar14 - iVar27;
  iVar15 = iVar15 - iVar30;
  iVar20 = iVar20 - iVar34;
  iVar26 = iVar157 + iVar4;
  iVar27 = iVar170 + iVar5;
  iVar30 = iVar174 + iVar6;
  iVar34 = iVar178 + iVar7;
  iVar4 = iVar4 - iVar157;
  iVar5 = iVar5 - iVar170;
  iVar6 = iVar6 - iVar174;
  iVar7 = iVar7 - iVar178;
  auVar98._4_4_ = iVar140;
  auVar98._0_4_ = iVar140;
  auVar98._8_4_ = iVar140;
  auVar98._12_4_ = iVar140;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x1a0);
  auVar47._4_4_ = uVar1;
  auVar47._0_4_ = uVar1;
  auVar47._8_4_ = uVar1;
  auVar47._12_4_ = uVar1;
  uVar145 = (uint)(iVar49 < iVar131) * iVar131 | (uint)(iVar49 >= iVar131) * iVar49;
  uVar152 = (uint)(iVar51 < iVar131) * iVar131 | (uint)(iVar51 >= iVar131) * iVar51;
  uVar155 = (uint)(iVar53 < iVar131) * iVar131 | (uint)(iVar53 >= iVar131) * iVar53;
  uVar158 = (uint)(iVar83 < iVar131) * iVar131 | (uint)(iVar83 >= iVar131) * iVar83;
  auVar167._0_4_ = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  auVar167._4_4_ = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  auVar167._8_4_ = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  auVar167._12_4_ = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  uVar145 = (uint)(iVar12 < iVar131) * iVar131 | (uint)(iVar12 >= iVar131) * iVar12;
  uVar152 = (uint)(iVar17 < iVar131) * iVar131 | (uint)(iVar17 >= iVar131) * iVar17;
  uVar155 = (uint)(iVar18 < iVar131) * iVar131 | (uint)(iVar18 >= iVar131) * iVar18;
  uVar158 = (uint)(iVar24 < iVar131) * iVar131 | (uint)(iVar24 >= iVar131) * iVar24;
  auVar38._0_4_ = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  auVar38._4_4_ = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  auVar38._8_4_ = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  auVar38._12_4_ = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  auVar127 = pmulld(auVar47,auVar38);
  auVar57 = pmulld(auVar38,auVar98);
  auVar168 = pmulld(auVar167,auVar47);
  auVar96 = pmulld(auVar167,auVar98);
  auVar185._4_4_ = iVar130;
  auVar185._0_4_ = iVar130;
  auVar185._8_4_ = iVar130;
  auVar185._12_4_ = iVar130;
  uVar145 = (uint)(iVar9 < iVar131) * iVar131 | (uint)(iVar9 >= iVar131) * iVar9;
  uVar152 = (uint)(iVar16 < iVar131) * iVar131 | (uint)(iVar16 >= iVar131) * iVar16;
  uVar155 = (uint)(iVar22 < iVar131) * iVar131 | (uint)(iVar22 >= iVar131) * iVar22;
  uVar158 = (uint)(iVar28 < iVar131) * iVar131 | (uint)(iVar28 >= iVar131) * iVar28;
  auVar39._0_4_ = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  auVar39._4_4_ = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  auVar39._8_4_ = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  auVar39._12_4_ = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  uVar145 = (uint)(iVar187 < iVar131) * iVar131 | (uint)(iVar187 >= iVar131) * iVar187;
  uVar152 = (uint)(iVar189 < iVar131) * iVar131 | (uint)(iVar189 >= iVar131) * iVar189;
  uVar155 = (uint)(iVar191 < iVar131) * iVar131 | (uint)(iVar191 >= iVar131) * iVar191;
  uVar158 = (uint)(iVar29 < iVar131) * iVar131 | (uint)(iVar29 >= iVar131) * iVar29;
  auVar150._0_4_ = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  auVar150._4_4_ = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  auVar150._8_4_ = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  auVar150._12_4_ = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  auVar164 = pmulld(auVar185,auVar150);
  auVar184 = pmulld(auVar150,auVar47);
  auVar67 = pmulld(auVar39,auVar185);
  auVar134 = pmulld(auVar39,auVar47);
  uVar145 = (uint)(iVar21 < iVar131) * iVar131 | (uint)(iVar21 >= iVar131) * iVar21;
  uVar152 = (uint)(iVar25 < iVar131) * iVar131 | (uint)(iVar25 >= iVar131) * iVar25;
  uVar155 = (uint)(iVar36 < iVar131) * iVar131 | (uint)(iVar36 >= iVar131) * iVar36;
  uVar158 = (uint)(iVar77 < iVar131) * iVar131 | (uint)(iVar77 >= iVar131) * iVar77;
  auVar59._0_4_ = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  auVar59._4_4_ = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  auVar59._8_4_ = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  auVar59._12_4_ = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  uVar145 = (uint)(iVar132 < iVar131) * iVar131 | (uint)(iVar132 >= iVar131) * iVar132;
  uVar152 = (uint)(iVar138 < iVar131) * iVar131 | (uint)(iVar138 >= iVar131) * iVar138;
  uVar155 = (uint)(iVar126 < iVar131) * iVar131 | (uint)(iVar126 >= iVar131) * iVar126;
  uVar158 = (uint)(iVar129 < iVar131) * iVar131 | (uint)(iVar129 >= iVar131) * iVar129;
  auVar147._0_4_ = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  auVar147._4_4_ = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  auVar147._8_4_ = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  auVar147._12_4_ = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  auVar183 = pmulld(auVar47,auVar147);
  auVar10 = pmulld(auVar147,auVar98);
  auVar118 = pmulld(auVar98,auVar59);
  auVar85 = pmulld(auVar59,auVar47);
  uVar145 = (uint)(iVar8 < iVar131) * iVar131 | (uint)(iVar8 >= iVar131) * iVar8;
  uVar152 = (uint)(iVar14 < iVar131) * iVar131 | (uint)(iVar14 >= iVar131) * iVar14;
  uVar155 = (uint)(iVar15 < iVar131) * iVar131 | (uint)(iVar15 >= iVar131) * iVar15;
  uVar158 = (uint)(iVar20 < iVar131) * iVar131 | (uint)(iVar20 >= iVar131) * iVar20;
  auVar76._0_4_ = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  auVar76._4_4_ = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  auVar76._8_4_ = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  auVar76._12_4_ = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  uVar145 = (uint)(iVar4 < iVar131) * iVar131 | (uint)(iVar4 >= iVar131) * iVar4;
  uVar152 = (uint)(iVar5 < iVar131) * iVar131 | (uint)(iVar5 >= iVar131) * iVar5;
  uVar155 = (uint)(iVar6 < iVar131) * iVar131 | (uint)(iVar6 >= iVar131) * iVar6;
  uVar158 = (uint)(iVar7 < iVar131) * iVar131 | (uint)(iVar7 >= iVar131) * iVar7;
  auVar33._0_4_ = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  auVar33._4_4_ = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  auVar33._8_4_ = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  auVar33._12_4_ = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  auVar44 = pmulld(auVar33,auVar47);
  auVar73 = pmulld(auVar47,auVar76);
  auVar109 = pmulld(auVar76,auVar185);
  auVar45 = pmulld(auVar33,auVar185);
  uVar145 = (uint)(iVar11 < iVar131) * iVar131 | (uint)(iVar11 >= iVar131) * iVar11;
  uVar152 = (uint)(iVar13 < iVar131) * iVar131 | (uint)(iVar13 >= iVar131) * iVar13;
  uVar155 = (uint)(iVar19 < iVar131) * iVar131 | (uint)(iVar19 >= iVar131) * iVar19;
  uVar158 = (uint)(iVar23 < iVar131) * iVar131 | (uint)(iVar23 >= iVar131) * iVar23;
  uVar161 = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  uVar171 = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  uVar175 = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  uVar179 = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  uVar145 = (uint)(iVar81 < iVar131) * iVar131 | (uint)(iVar81 >= iVar131) * iVar81;
  uVar152 = (uint)(iVar101 < iVar131) * iVar131 | (uint)(iVar101 >= iVar131) * iVar101;
  uVar155 = (uint)(iVar112 < iVar131) * iVar131 | (uint)(iVar112 >= iVar131) * iVar112;
  uVar158 = (uint)(iVar151 < iVar131) * iVar131 | (uint)(iVar151 >= iVar131) * iVar151;
  uVar145 = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  uVar152 = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  uVar155 = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  uVar158 = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  iVar129 = uVar145 + uVar161;
  iVar6 = uVar152 + uVar171;
  iVar12 = uVar155 + uVar175;
  iVar17 = uVar158 + uVar179;
  iVar36 = uVar161 - uVar145;
  iVar77 = uVar171 - uVar152;
  iVar81 = uVar175 - uVar155;
  iVar101 = uVar179 - uVar158;
  uVar145 = (uint)(iVar103 < iVar131) * iVar131 | (uint)(iVar103 >= iVar131) * iVar103;
  uVar152 = (uint)(iVar107 < iVar131) * iVar131 | (uint)(iVar107 >= iVar131) * iVar107;
  uVar155 = (uint)(iVar110 < iVar131) * iVar131 | (uint)(iVar110 >= iVar131) * iVar110;
  uVar158 = (uint)(iVar115 < iVar131) * iVar131 | (uint)(iVar115 >= iVar131) * iVar115;
  uVar161 = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  uVar171 = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  uVar175 = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  uVar179 = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  uVar145 = (uint)(iVar88 < iVar131) * iVar131 | (uint)(iVar88 >= iVar131) * iVar88;
  uVar152 = (uint)(iVar90 < iVar131) * iVar131 | (uint)(iVar90 >= iVar131) * iVar90;
  uVar155 = (uint)(iVar92 < iVar131) * iVar131 | (uint)(iVar92 >= iVar131) * iVar92;
  uVar158 = (uint)(iVar116 < iVar131) * iVar131 | (uint)(iVar116 >= iVar131) * iVar116;
  uVar145 = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  uVar152 = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  uVar155 = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  uVar158 = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  iVar130 = uVar145 + uVar161;
  iVar7 = uVar152 + uVar171;
  iVar13 = uVar155 + uVar175;
  iVar18 = uVar158 + uVar179;
  iVar53 = uVar161 - uVar145;
  iVar83 = uVar171 - uVar152;
  iVar88 = uVar175 - uVar155;
  iVar90 = uVar179 - uVar158;
  iVar132 = auVar168._0_4_ + iVar3 + auVar57._0_4_ >> auVar58;
  iVar138 = auVar168._4_4_ + iVar3 + auVar57._4_4_ >> auVar58;
  iVar140 = auVar168._8_4_ + iVar3 + auVar57._8_4_ >> auVar58;
  iVar126 = auVar168._12_4_ + iVar3 + auVar57._12_4_ >> auVar58;
  iVar103 = (auVar96._0_4_ + iVar3) - auVar127._0_4_ >> auVar58;
  iVar107 = (auVar96._4_4_ + iVar3) - auVar127._4_4_ >> auVar58;
  iVar110 = (auVar96._8_4_ + iVar3) - auVar127._8_4_ >> auVar58;
  iVar112 = (auVar96._12_4_ + iVar3) - auVar127._12_4_ >> auVar58;
  iVar5 = auVar67._0_4_ + iVar3 + auVar184._0_4_ >> auVar58;
  iVar11 = auVar67._4_4_ + iVar3 + auVar184._4_4_ >> auVar58;
  iVar15 = auVar67._8_4_ + iVar3 + auVar184._8_4_ >> auVar58;
  iVar20 = auVar67._12_4_ + iVar3 + auVar184._12_4_ >> auVar58;
  iVar115 = (auVar134._0_4_ + iVar3) - auVar164._0_4_ >> auVar58;
  iVar151 = (auVar134._4_4_ + iVar3) - auVar164._4_4_ >> auVar58;
  iVar157 = (auVar134._8_4_ + iVar3) - auVar164._8_4_ >> auVar58;
  iVar170 = (auVar134._12_4_ + iVar3) - auVar164._12_4_ >> auVar58;
  iVar4 = iVar5 + iVar132;
  iVar8 = iVar11 + iVar138;
  iVar14 = iVar15 + iVar140;
  iVar19 = iVar20 + iVar126;
  iVar132 = iVar132 - iVar5;
  iVar138 = iVar138 - iVar11;
  iVar140 = iVar140 - iVar15;
  iVar126 = iVar126 - iVar20;
  iVar21 = iVar115 + iVar103;
  iVar23 = iVar151 + iVar107;
  iVar24 = iVar157 + iVar110;
  iVar25 = iVar170 + iVar112;
  iVar103 = iVar103 - iVar115;
  iVar107 = iVar107 - iVar151;
  iVar110 = iVar110 - iVar157;
  iVar112 = iVar112 - iVar170;
  uVar145 = (uint)(iVar114 < iVar131) * iVar131 | (uint)(iVar114 >= iVar131) * iVar114;
  uVar152 = (uint)(iVar144 < iVar131) * iVar131 | (uint)(iVar144 >= iVar131) * iVar144;
  uVar155 = (uint)(iVar154 < iVar131) * iVar131 | (uint)(iVar154 >= iVar131) * iVar154;
  uVar158 = (uint)(iVar160 < iVar131) * iVar131 | (uint)(iVar160 >= iVar131) * iVar160;
  uVar161 = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  uVar171 = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  uVar175 = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  uVar179 = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  uVar145 = (uint)(iVar35 < iVar131) * iVar131 | (uint)(iVar35 >= iVar131) * iVar35;
  uVar152 = (uint)(iVar71 < iVar131) * iVar131 | (uint)(iVar71 >= iVar131) * iVar71;
  uVar155 = (uint)(iVar79 < iVar131) * iVar131 | (uint)(iVar79 >= iVar131) * iVar79;
  uVar158 = (uint)(iVar94 < iVar131) * iVar131 | (uint)(iVar94 >= iVar131) * iVar94;
  uVar145 = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  uVar152 = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  uVar155 = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  uVar158 = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  iVar5 = uVar145 + uVar161;
  iVar11 = uVar152 + uVar171;
  iVar15 = uVar155 + uVar175;
  iVar20 = uVar158 + uVar179;
  iVar154 = uVar161 - uVar145;
  iVar157 = uVar171 - uVar152;
  iVar160 = uVar175 - uVar155;
  iVar170 = uVar179 - uVar158;
  uVar145 = (uint)(iVar105 < iVar131) * iVar131 | (uint)(iVar105 >= iVar131) * iVar105;
  uVar152 = (uint)(iVar108 < iVar131) * iVar131 | (uint)(iVar108 >= iVar131) * iVar108;
  uVar155 = (uint)(iVar111 < iVar131) * iVar131 | (uint)(iVar111 >= iVar131) * iVar111;
  uVar158 = (uint)(iVar113 < iVar131) * iVar131 | (uint)(iVar113 >= iVar131) * iVar113;
  uVar161 = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  uVar171 = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  uVar175 = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  uVar179 = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  uVar145 = (uint)(iVar26 < iVar131) * iVar131 | (uint)(iVar26 >= iVar131) * iVar26;
  uVar152 = (uint)(iVar27 < iVar131) * iVar131 | (uint)(iVar27 >= iVar131) * iVar27;
  uVar155 = (uint)(iVar30 < iVar131) * iVar131 | (uint)(iVar30 >= iVar131) * iVar30;
  uVar158 = (uint)(iVar34 < iVar131) * iVar131 | (uint)(iVar34 >= iVar131) * iVar34;
  uVar145 = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  uVar152 = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  uVar155 = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  uVar158 = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  iVar16 = uVar145 + uVar161;
  iVar189 = uVar152 + uVar171;
  iVar22 = uVar155 + uVar175;
  iVar191 = uVar158 + uVar179;
  iVar28 = uVar161 - uVar145;
  iVar29 = uVar171 - uVar152;
  iVar49 = uVar175 - uVar155;
  iVar51 = uVar179 - uVar158;
  iVar35 = auVar85._0_4_ + iVar3 + auVar10._0_4_ >> auVar58;
  iVar71 = auVar85._4_4_ + iVar3 + auVar10._4_4_ >> auVar58;
  iVar79 = auVar85._8_4_ + iVar3 + auVar10._8_4_ >> auVar58;
  iVar94 = auVar85._12_4_ + iVar3 + auVar10._12_4_ >> auVar58;
  iVar174 = (auVar118._0_4_ + iVar3) - auVar183._0_4_ >> auVar58;
  iVar178 = (auVar118._4_4_ + iVar3) - auVar183._4_4_ >> auVar58;
  iVar9 = (auVar118._8_4_ + iVar3) - auVar183._8_4_ >> auVar58;
  iVar187 = (auVar118._12_4_ + iVar3) - auVar183._12_4_ >> auVar58;
  iVar114 = auVar109._0_4_ + iVar3 + auVar44._0_4_ >> auVar58;
  iVar115 = auVar109._4_4_ + iVar3 + auVar44._4_4_ >> auVar58;
  iVar144 = auVar109._8_4_ + iVar3 + auVar44._8_4_ >> auVar58;
  iVar151 = auVar109._12_4_ + iVar3 + auVar44._12_4_ >> auVar58;
  iVar26 = (auVar73._0_4_ + iVar3) - auVar45._0_4_ >> auVar58;
  iVar27 = (auVar73._4_4_ + iVar3) - auVar45._4_4_ >> auVar58;
  iVar30 = (auVar73._8_4_ + iVar3) - auVar45._8_4_ >> auVar58;
  iVar34 = (auVar73._12_4_ + iVar3) - auVar45._12_4_ >> auVar58;
  iVar105 = iVar114 + iVar35;
  iVar108 = iVar115 + iVar71;
  iVar111 = iVar144 + iVar79;
  iVar113 = iVar151 + iVar94;
  iVar35 = iVar35 - iVar114;
  iVar71 = iVar71 - iVar115;
  iVar79 = iVar79 - iVar144;
  iVar94 = iVar94 - iVar151;
  iVar114 = iVar26 + iVar174;
  iVar115 = iVar27 + iVar178;
  iVar144 = iVar30 + iVar9;
  iVar151 = iVar34 + iVar187;
  iVar174 = iVar174 - iVar26;
  iVar178 = iVar178 - iVar27;
  iVar9 = iVar9 - iVar30;
  iVar187 = iVar187 - iVar34;
  uVar43 = (uint)(iVar129 < iVar131) * iVar131 | (uint)(iVar129 >= iVar131) * iVar129;
  uVar50 = (uint)(iVar6 < iVar131) * iVar131 | (uint)(iVar6 >= iVar131) * iVar6;
  uVar52 = (uint)(iVar12 < iVar131) * iVar131 | (uint)(iVar12 >= iVar131) * iVar12;
  uVar54 = (uint)(iVar17 < iVar131) * iVar131 | (uint)(iVar17 >= iVar131) * iVar17;
  uVar145 = (uint)(iVar36 < iVar131) * iVar131 | (uint)(iVar36 >= iVar131) * iVar36;
  uVar152 = (uint)(iVar77 < iVar131) * iVar131 | (uint)(iVar77 >= iVar131) * iVar77;
  uVar155 = (uint)(iVar81 < iVar131) * iVar131 | (uint)(iVar81 >= iVar131) * iVar81;
  uVar158 = (uint)(iVar101 < iVar131) * iVar131 | (uint)(iVar101 >= iVar131) * iVar101;
  uVar72 = (uint)(iVar130 < iVar131) * iVar131 | (uint)(iVar130 >= iVar131) * iVar130;
  uVar78 = (uint)(iVar7 < iVar131) * iVar131 | (uint)(iVar7 >= iVar131) * iVar7;
  uVar80 = (uint)(iVar13 < iVar131) * iVar131 | (uint)(iVar13 >= iVar131) * iVar13;
  uVar82 = (uint)(iVar18 < iVar131) * iVar131 | (uint)(iVar18 >= iVar131) * iVar18;
  uVar182 = (uint)(iVar53 < iVar131) * iVar131 | (uint)(iVar53 >= iVar131) * iVar53;
  uVar188 = (uint)(iVar83 < iVar131) * iVar131 | (uint)(iVar83 >= iVar131) * iVar83;
  uVar190 = (uint)(iVar88 < iVar131) * iVar131 | (uint)(iVar88 >= iVar131) * iVar88;
  uVar192 = (uint)(iVar90 < iVar131) * iVar131 | (uint)(iVar90 >= iVar131) * iVar90;
  uVar162 = (uint)(iVar4 < iVar131) * iVar131 | (uint)(iVar4 >= iVar131) * iVar4;
  uVar172 = (uint)(iVar8 < iVar131) * iVar131 | (uint)(iVar8 >= iVar131) * iVar8;
  uVar176 = (uint)(iVar14 < iVar131) * iVar131 | (uint)(iVar14 >= iVar131) * iVar14;
  uVar180 = (uint)(iVar19 < iVar131) * iVar131 | (uint)(iVar19 >= iVar131) * iVar19;
  uVar163 = (uint)(iVar132 < iVar131) * iVar131 | (uint)(iVar132 >= iVar131) * iVar132;
  uVar173 = (uint)(iVar138 < iVar131) * iVar131 | (uint)(iVar138 >= iVar131) * iVar138;
  uVar177 = (uint)(iVar140 < iVar131) * iVar131 | (uint)(iVar140 >= iVar131) * iVar140;
  uVar181 = (uint)(iVar126 < iVar131) * iVar131 | (uint)(iVar126 >= iVar131) * iVar126;
  uVar37 = (uint)(iVar21 < iVar131) * iVar131 | (uint)(iVar21 >= iVar131) * iVar21;
  uVar40 = (uint)(iVar23 < iVar131) * iVar131 | (uint)(iVar23 >= iVar131) * iVar23;
  uVar41 = (uint)(iVar24 < iVar131) * iVar131 | (uint)(iVar24 >= iVar131) * iVar24;
  uVar42 = (uint)(iVar25 < iVar131) * iVar131 | (uint)(iVar25 >= iVar131) * iVar25;
  uVar95 = (uint)(iVar103 < iVar131) * iVar131 | (uint)(iVar103 >= iVar131) * iVar103;
  uVar102 = (uint)(iVar107 < iVar131) * iVar131 | (uint)(iVar107 >= iVar131) * iVar107;
  uVar104 = (uint)(iVar110 < iVar131) * iVar131 | (uint)(iVar110 >= iVar131) * iVar110;
  uVar106 = (uint)(iVar112 < iVar131) * iVar131 | (uint)(iVar112 >= iVar131) * iVar112;
  uVar161 = (uint)(iVar5 < iVar131) * iVar131 | (uint)(iVar5 >= iVar131) * iVar5;
  uVar171 = (uint)(iVar11 < iVar131) * iVar131 | (uint)(iVar11 >= iVar131) * iVar11;
  uVar175 = (uint)(iVar15 < iVar131) * iVar131 | (uint)(iVar15 >= iVar131) * iVar15;
  uVar179 = (uint)(iVar20 < iVar131) * iVar131 | (uint)(iVar20 >= iVar131) * iVar20;
  uVar84 = (uint)(iVar154 < iVar131) * iVar131 | (uint)(iVar154 >= iVar131) * iVar154;
  uVar89 = (uint)(iVar157 < iVar131) * iVar131 | (uint)(iVar157 >= iVar131) * iVar157;
  uVar91 = (uint)(iVar160 < iVar131) * iVar131 | (uint)(iVar160 >= iVar131) * iVar160;
  uVar93 = (uint)(iVar170 < iVar131) * iVar131 | (uint)(iVar170 >= iVar131) * iVar170;
  uVar117 = (uint)(iVar16 < iVar131) * iVar131 | (uint)(iVar16 >= iVar131) * iVar16;
  uVar121 = (uint)(iVar189 < iVar131) * iVar131 | (uint)(iVar189 >= iVar131) * iVar189;
  uVar123 = (uint)(iVar22 < iVar131) * iVar131 | (uint)(iVar22 >= iVar131) * iVar22;
  uVar125 = (uint)(iVar191 < iVar131) * iVar131 | (uint)(iVar191 >= iVar131) * iVar191;
  uVar133 = (uint)(iVar28 < iVar131) * iVar131 | (uint)(iVar28 >= iVar131) * iVar28;
  uVar139 = (uint)(iVar29 < iVar131) * iVar131 | (uint)(iVar29 >= iVar131) * iVar29;
  uVar141 = (uint)(iVar49 < iVar131) * iVar131 | (uint)(iVar49 >= iVar131) * iVar49;
  uVar143 = (uint)(iVar51 < iVar131) * iVar131 | (uint)(iVar51 >= iVar131) * iVar51;
  uVar66 = (uint)(iVar105 < iVar131) * iVar131 | (uint)(iVar105 >= iVar131) * iVar105;
  uVar68 = (uint)(iVar108 < iVar131) * iVar131 | (uint)(iVar108 >= iVar131) * iVar108;
  uVar69 = (uint)(iVar111 < iVar131) * iVar131 | (uint)(iVar111 >= iVar131) * iVar111;
  uVar70 = (uint)(iVar113 < iVar131) * iVar131 | (uint)(iVar113 >= iVar131) * iVar113;
  uVar55 = (uint)(iVar35 < iVar131) * iVar131 | (uint)(iVar35 >= iVar131) * iVar35;
  uVar60 = (uint)(iVar71 < iVar131) * iVar131 | (uint)(iVar71 >= iVar131) * iVar71;
  uVar62 = (uint)(iVar79 < iVar131) * iVar131 | (uint)(iVar79 >= iVar131) * iVar79;
  uVar64 = (uint)(iVar94 < iVar131) * iVar131 | (uint)(iVar94 >= iVar131) * iVar94;
  uVar146 = (uint)(iVar114 < iVar131) * iVar131 | (uint)(iVar114 >= iVar131) * iVar114;
  uVar153 = (uint)(iVar115 < iVar131) * iVar131 | (uint)(iVar115 >= iVar131) * iVar115;
  uVar156 = (uint)(iVar144 < iVar131) * iVar131 | (uint)(iVar144 >= iVar131) * iVar144;
  uVar159 = (uint)(iVar151 < iVar131) * iVar131 | (uint)(iVar151 >= iVar131) * iVar151;
  uVar56 = (uint)(iVar174 < iVar131) * iVar131 | (uint)(iVar174 >= iVar131) * iVar174;
  uVar61 = (uint)(iVar178 < iVar131) * iVar131 | (uint)(iVar178 >= iVar131) * iVar178;
  uVar63 = (uint)(iVar9 < iVar131) * iVar131 | (uint)(iVar9 >= iVar131) * iVar9;
  uVar65 = (uint)(iVar187 < iVar131) * iVar131 | (uint)(iVar187 >= iVar131) * iVar187;
  uVar43 = (uint)(iVar142 < (int)uVar43) * iVar142 | (iVar142 >= (int)uVar43) * uVar43;
  uVar50 = (uint)(iVar142 < (int)uVar50) * iVar142 | (iVar142 >= (int)uVar50) * uVar50;
  uVar52 = (uint)(iVar142 < (int)uVar52) * iVar142 | (iVar142 >= (int)uVar52) * uVar52;
  uVar54 = (uint)(iVar142 < (int)uVar54) * iVar142 | (iVar142 >= (int)uVar54) * uVar54;
  auVar128._0_4_ = (uint)(iVar142 < (int)uVar145) * iVar142 | (iVar142 >= (int)uVar145) * uVar145;
  auVar128._4_4_ = (uint)(iVar142 < (int)uVar152) * iVar142 | (iVar142 >= (int)uVar152) * uVar152;
  auVar128._8_4_ = (uint)(iVar142 < (int)uVar155) * iVar142 | (iVar142 >= (int)uVar155) * uVar155;
  auVar128._12_4_ = (uint)(iVar142 < (int)uVar158) * iVar142 | (iVar142 >= (int)uVar158) * uVar158;
  uVar72 = (uint)(iVar142 < (int)uVar72) * iVar142 | (iVar142 >= (int)uVar72) * uVar72;
  uVar78 = (uint)(iVar142 < (int)uVar78) * iVar142 | (iVar142 >= (int)uVar78) * uVar78;
  uVar80 = (uint)(iVar142 < (int)uVar80) * iVar142 | (iVar142 >= (int)uVar80) * uVar80;
  uVar82 = (uint)(iVar142 < (int)uVar82) * iVar142 | (iVar142 >= (int)uVar82) * uVar82;
  auVar186._0_4_ = (uint)(iVar142 < (int)uVar182) * iVar142 | (iVar142 >= (int)uVar182) * uVar182;
  auVar186._4_4_ = (uint)(iVar142 < (int)uVar188) * iVar142 | (iVar142 >= (int)uVar188) * uVar188;
  auVar186._8_4_ = (uint)(iVar142 < (int)uVar190) * iVar142 | (iVar142 >= (int)uVar190) * uVar190;
  auVar186._12_4_ = (uint)(iVar142 < (int)uVar192) * iVar142 | (iVar142 >= (int)uVar192) * uVar192;
  uVar145 = (uint)(iVar142 < (int)uVar162) * iVar142 | (iVar142 >= (int)uVar162) * uVar162;
  uVar152 = (uint)(iVar142 < (int)uVar172) * iVar142 | (iVar142 >= (int)uVar172) * uVar172;
  uVar155 = (uint)(iVar142 < (int)uVar176) * iVar142 | (iVar142 >= (int)uVar176) * uVar176;
  uVar158 = (uint)(iVar142 < (int)uVar180) * iVar142 | (iVar142 >= (int)uVar180) * uVar180;
  auVar169._0_4_ = (uint)(iVar142 < (int)uVar163) * iVar142 | (iVar142 >= (int)uVar163) * uVar163;
  auVar169._4_4_ = (uint)(iVar142 < (int)uVar173) * iVar142 | (iVar142 >= (int)uVar173) * uVar173;
  auVar169._8_4_ = (uint)(iVar142 < (int)uVar177) * iVar142 | (iVar142 >= (int)uVar177) * uVar177;
  auVar169._12_4_ = (uint)(iVar142 < (int)uVar181) * iVar142 | (iVar142 >= (int)uVar181) * uVar181;
  uVar37 = (uint)(iVar142 < (int)uVar37) * iVar142 | (iVar142 >= (int)uVar37) * uVar37;
  uVar40 = (uint)(iVar142 < (int)uVar40) * iVar142 | (iVar142 >= (int)uVar40) * uVar40;
  uStack_f0._0_4_ = (uint)(iVar142 < (int)uVar41) * iVar142 | (iVar142 >= (int)uVar41) * uVar41;
  uStack_f0._4_4_ = (uint)(iVar142 < (int)uVar42) * iVar142 | (iVar142 >= (int)uVar42) * uVar42;
  local_f8 = CONCAT44(uVar40,uVar37);
  auVar99._0_4_ = (uint)(iVar142 < (int)uVar95) * iVar142 | (iVar142 >= (int)uVar95) * uVar95;
  auVar99._4_4_ = (uint)(iVar142 < (int)uVar102) * iVar142 | (iVar142 >= (int)uVar102) * uVar102;
  auVar99._8_4_ = (uint)(iVar142 < (int)uVar104) * iVar142 | (iVar142 >= (int)uVar104) * uVar104;
  auVar99._12_4_ = (uint)(iVar142 < (int)uVar106) * iVar142 | (iVar142 >= (int)uVar106) * uVar106;
  uVar161 = (uint)(iVar142 < (int)uVar161) * iVar142 | (iVar142 >= (int)uVar161) * uVar161;
  uVar171 = (uint)(iVar142 < (int)uVar171) * iVar142 | (iVar142 >= (int)uVar171) * uVar171;
  uVar175 = (uint)(iVar142 < (int)uVar175) * iVar142 | (iVar142 >= (int)uVar175) * uVar175;
  uVar179 = (uint)(iVar142 < (int)uVar179) * iVar142 | (iVar142 >= (int)uVar179) * uVar179;
  auVar87._0_4_ = (uint)(iVar142 < (int)uVar84) * iVar142 | (iVar142 >= (int)uVar84) * uVar84;
  auVar87._4_4_ = (uint)(iVar142 < (int)uVar89) * iVar142 | (iVar142 >= (int)uVar89) * uVar89;
  auVar87._8_4_ = (uint)(iVar142 < (int)uVar91) * iVar142 | (iVar142 >= (int)uVar91) * uVar91;
  auVar87._12_4_ = (uint)(iVar142 < (int)uVar93) * iVar142 | (iVar142 >= (int)uVar93) * uVar93;
  uVar84 = (uint)(iVar142 < (int)uVar117) * iVar142 | (iVar142 >= (int)uVar117) * uVar117;
  uVar89 = (uint)(iVar142 < (int)uVar121) * iVar142 | (iVar142 >= (int)uVar121) * uVar121;
  uVar91 = (uint)(iVar142 < (int)uVar123) * iVar142 | (iVar142 >= (int)uVar123) * uVar123;
  uVar93 = (uint)(iVar142 < (int)uVar125) * iVar142 | (iVar142 >= (int)uVar125) * uVar125;
  auVar137._0_4_ = (uint)(iVar142 < (int)uVar133) * iVar142 | (iVar142 >= (int)uVar133) * uVar133;
  auVar137._4_4_ = (uint)(iVar142 < (int)uVar139) * iVar142 | (iVar142 >= (int)uVar139) * uVar139;
  auVar137._8_4_ = (uint)(iVar142 < (int)uVar141) * iVar142 | (iVar142 >= (int)uVar141) * uVar141;
  auVar137._12_4_ = (uint)(iVar142 < (int)uVar143) * iVar142 | (iVar142 >= (int)uVar143) * uVar143;
  uVar41 = (uint)(iVar142 < (int)uVar66) * iVar142 | (iVar142 >= (int)uVar66) * uVar66;
  uVar42 = (uint)(iVar142 < (int)uVar68) * iVar142 | (iVar142 >= (int)uVar68) * uVar68;
  uVar66 = (uint)(iVar142 < (int)uVar69) * iVar142 | (iVar142 >= (int)uVar69) * uVar69;
  uVar68 = (uint)(iVar142 < (int)uVar70) * iVar142 | (iVar142 >= (int)uVar70) * uVar70;
  auVar168._0_4_ = (uint)(iVar142 < (int)uVar55) * iVar142 | (iVar142 >= (int)uVar55) * uVar55;
  auVar168._4_4_ = (uint)(iVar142 < (int)uVar60) * iVar142 | (iVar142 >= (int)uVar60) * uVar60;
  auVar168._8_4_ = (uint)(iVar142 < (int)uVar62) * iVar142 | (iVar142 >= (int)uVar62) * uVar62;
  auVar168._12_4_ = (uint)(iVar142 < (int)uVar64) * iVar142 | (iVar142 >= (int)uVar64) * uVar64;
  uVar55 = (uint)(iVar142 < (int)uVar146) * iVar142 | (iVar142 >= (int)uVar146) * uVar146;
  uVar60 = (uint)(iVar142 < (int)uVar153) * iVar142 | (iVar142 >= (int)uVar153) * uVar153;
  uVar62 = (uint)(iVar142 < (int)uVar156) * iVar142 | (iVar142 >= (int)uVar156) * uVar156;
  uVar64 = (uint)(iVar142 < (int)uVar159) * iVar142 | (iVar142 >= (int)uVar159) * uVar159;
  auVar100._0_4_ = (uint)(iVar142 < (int)uVar56) * iVar142 | (iVar142 >= (int)uVar56) * uVar56;
  auVar100._4_4_ = (uint)(iVar142 < (int)uVar61) * iVar142 | (iVar142 >= (int)uVar61) * uVar61;
  auVar100._8_4_ = (uint)(iVar142 < (int)uVar63) * iVar142 | (iVar142 >= (int)uVar63) * uVar63;
  auVar100._12_4_ = (uint)(iVar142 < (int)uVar65) * iVar142 | (iVar142 >= (int)uVar65) * uVar65;
  uVar1 = *(undefined4 *)((long)vert_filter_length_chroma + lVar2 + 0x1e0);
  auVar48._4_4_ = uVar1;
  auVar48._0_4_ = uVar1;
  auVar48._8_4_ = uVar1;
  auVar48._12_4_ = uVar1;
  auVar10 = pmulld(auVar128,auVar48);
  auVar67 = pmulld(auVar186,auVar48);
  iVar132 = auVar10._0_4_ + iVar3;
  iVar138 = auVar10._4_4_ + iVar3;
  iVar140 = auVar10._8_4_ + iVar3;
  iVar142 = auVar10._12_4_ + iVar3;
  auVar10 = pmulld(auVar169,auVar48);
  auVar44 = pmulld(auVar99,auVar48);
  iVar8 = auVar10._0_4_ + iVar3;
  iVar11 = auVar10._4_4_ + iVar3;
  iVar12 = auVar10._8_4_ + iVar3;
  iVar13 = auVar10._12_4_ + iVar3;
  auVar10 = pmulld(auVar87,auVar48);
  auVar45 = pmulld(auVar137,auVar48);
  iVar4 = auVar10._0_4_ + iVar3;
  iVar5 = auVar10._4_4_ + iVar3;
  iVar6 = auVar10._8_4_ + iVar3;
  iVar7 = auVar10._12_4_ + iVar3;
  auVar57 = pmulld(auVar168,auVar48);
  auVar10 = pmulld(auVar100,auVar48);
  iVar19 = auVar57._0_4_ + iVar3;
  iVar20 = auVar57._4_4_ + iVar3;
  iVar21 = auVar57._8_4_ + iVar3;
  iVar3 = auVar57._12_4_ + iVar3;
  iVar126 = iVar132 + auVar67._0_4_ >> auVar58;
  iVar129 = iVar138 + auVar67._4_4_ >> auVar58;
  iVar130 = iVar140 + auVar67._8_4_ >> auVar58;
  iVar131 = iVar142 + auVar67._12_4_ >> auVar58;
  iVar27 = iVar132 - auVar67._0_4_ >> auVar58;
  iVar30 = iVar138 - auVar67._4_4_ >> auVar58;
  iVar34 = iVar140 - auVar67._8_4_ >> auVar58;
  iVar35 = iVar142 - auVar67._12_4_ >> auVar58;
  iVar14 = iVar8 + auVar44._0_4_ >> auVar58;
  iVar15 = iVar11 + auVar44._4_4_ >> auVar58;
  iVar17 = iVar12 + auVar44._8_4_ >> auVar58;
  iVar18 = iVar13 + auVar44._12_4_ >> auVar58;
  iVar23 = iVar8 - auVar44._0_4_ >> auVar58;
  iVar24 = iVar11 - auVar44._4_4_ >> auVar58;
  iVar25 = iVar12 - auVar44._8_4_ >> auVar58;
  iVar26 = iVar13 - auVar44._12_4_ >> auVar58;
  iVar132 = iVar4 + auVar45._0_4_ >> auVar58;
  iVar138 = iVar5 + auVar45._4_4_ >> auVar58;
  iVar140 = iVar6 + auVar45._8_4_ >> auVar58;
  iVar142 = iVar7 + auVar45._12_4_ >> auVar58;
  iVar4 = iVar4 - auVar45._0_4_ >> auVar58;
  iVar5 = iVar5 - auVar45._4_4_ >> auVar58;
  iVar6 = iVar6 - auVar45._8_4_ >> auVar58;
  iVar7 = iVar7 - auVar45._12_4_ >> auVar58;
  iVar8 = iVar19 + auVar10._0_4_ >> auVar58;
  iVar11 = iVar20 + auVar10._4_4_ >> auVar58;
  iVar12 = iVar21 + auVar10._8_4_ >> auVar58;
  iVar13 = iVar3 + auVar10._12_4_ >> auVar58;
  iVar19 = iVar19 - auVar10._0_4_ >> auVar58;
  iVar20 = iVar20 - auVar10._4_4_ >> auVar58;
  iVar21 = iVar21 - auVar10._8_4_ >> auVar58;
  iVar3 = iVar3 - auVar10._12_4_ >> auVar58;
  if (do_cols == 0) {
    iVar36 = 10;
    if (10 < bd) {
      iVar36 = bd;
    }
    iVar36 = 0x20 << ((byte)iVar36 & 0x1f);
    iVar101 = (1 << ((byte)out_shift & 0x1f)) >> 1;
    iVar71 = -iVar36;
    iVar36 = iVar36 + -1;
    auVar10 = ZEXT416((uint)out_shift);
    iVar77 = (int)(uVar43 + iVar101) >> auVar10;
    iVar79 = (int)(uVar50 + iVar101) >> auVar10;
    iVar81 = (int)(uVar52 + iVar101) >> auVar10;
    iVar94 = (int)(uVar54 + iVar101) >> auVar10;
    uVar43 = (uint)(iVar77 < iVar71) * iVar71 | (uint)(iVar77 >= iVar71) * iVar77;
    uVar50 = (uint)(iVar79 < iVar71) * iVar71 | (uint)(iVar79 >= iVar71) * iVar79;
    uVar52 = (uint)(iVar81 < iVar71) * iVar71 | (uint)(iVar81 >= iVar71) * iVar81;
    uVar54 = (uint)(iVar94 < iVar71) * iVar71 | (uint)(iVar94 >= iVar71) * iVar94;
    *(uint *)*out = (uint)(iVar36 < (int)uVar43) * iVar36 | (iVar36 >= (int)uVar43) * uVar43;
    *(uint *)((long)*out + 4) =
         (uint)(iVar36 < (int)uVar50) * iVar36 | (iVar36 >= (int)uVar50) * uVar50;
    *(uint *)(*out + 1) = (uint)(iVar36 < (int)uVar52) * iVar36 | (iVar36 >= (int)uVar52) * uVar52;
    *(uint *)((long)*out + 0xc) =
         (uint)(iVar36 < (int)uVar54) * iVar36 | (iVar36 >= (int)uVar54) * uVar54;
    iVar77 = (int)(iVar101 - uVar161) >> auVar10;
    iVar79 = (int)(iVar101 - uVar171) >> auVar10;
    iVar81 = (int)(iVar101 - uVar175) >> auVar10;
    iVar94 = (int)(iVar101 - uVar179) >> auVar10;
    uVar161 = (uint)(iVar77 < iVar71) * iVar71 | (uint)(iVar77 >= iVar71) * iVar77;
    uVar171 = (uint)(iVar79 < iVar71) * iVar71 | (uint)(iVar79 >= iVar71) * iVar79;
    uVar175 = (uint)(iVar81 < iVar71) * iVar71 | (uint)(iVar81 >= iVar71) * iVar81;
    uVar179 = (uint)(iVar94 < iVar71) * iVar71 | (uint)(iVar94 >= iVar71) * iVar94;
    *(uint *)out[1] = (uint)(iVar36 < (int)uVar161) * iVar36 | (iVar36 >= (int)uVar161) * uVar161;
    *(uint *)((long)out[1] + 4) =
         (uint)(iVar36 < (int)uVar171) * iVar36 | (iVar36 >= (int)uVar171) * uVar171;
    *(uint *)(out[1] + 1) =
         (uint)(iVar36 < (int)uVar175) * iVar36 | (iVar36 >= (int)uVar175) * uVar175;
    *(uint *)((long)out[1] + 0xc) =
         (uint)(iVar36 < (int)uVar179) * iVar36 | (iVar36 >= (int)uVar179) * uVar179;
    iVar77 = (int)(uVar41 + iVar101) >> auVar10;
    iVar79 = (int)(uVar42 + iVar101) >> auVar10;
    iVar81 = (int)(uVar66 + iVar101) >> auVar10;
    iVar94 = (int)(uVar68 + iVar101) >> auVar10;
    uVar161 = (uint)(iVar77 < iVar71) * iVar71 | (uint)(iVar77 >= iVar71) * iVar77;
    uVar171 = (uint)(iVar79 < iVar71) * iVar71 | (uint)(iVar79 >= iVar71) * iVar79;
    uVar175 = (uint)(iVar81 < iVar71) * iVar71 | (uint)(iVar81 >= iVar71) * iVar81;
    uVar179 = (uint)(iVar94 < iVar71) * iVar71 | (uint)(iVar94 >= iVar71) * iVar94;
    *(uint *)out[2] = (uint)(iVar36 < (int)uVar161) * iVar36 | (iVar36 >= (int)uVar161) * uVar161;
    *(uint *)((long)out[2] + 4) =
         (uint)(iVar36 < (int)uVar171) * iVar36 | (iVar36 >= (int)uVar171) * uVar171;
    *(uint *)(out[2] + 1) =
         (uint)(iVar36 < (int)uVar175) * iVar36 | (iVar36 >= (int)uVar175) * uVar175;
    *(uint *)((long)out[2] + 0xc) =
         (uint)(iVar36 < (int)uVar179) * iVar36 | (iVar36 >= (int)uVar179) * uVar179;
    iVar77 = (int)(iVar101 - uVar145) >> auVar10;
    iVar79 = (int)(iVar101 - uVar152) >> auVar10;
    iVar81 = (int)(iVar101 - uVar155) >> auVar10;
    iVar94 = (int)(iVar101 - uVar158) >> auVar10;
    uVar145 = (uint)(iVar77 < iVar71) * iVar71 | (uint)(iVar77 >= iVar71) * iVar77;
    uVar152 = (uint)(iVar79 < iVar71) * iVar71 | (uint)(iVar79 >= iVar71) * iVar79;
    uVar155 = (uint)(iVar81 < iVar71) * iVar71 | (uint)(iVar81 >= iVar71) * iVar81;
    uVar158 = (uint)(iVar94 < iVar71) * iVar71 | (uint)(iVar94 >= iVar71) * iVar94;
    *(uint *)out[3] = (uint)(iVar36 < (int)uVar145) * iVar36 | (iVar36 >= (int)uVar145) * uVar145;
    *(uint *)((long)out[3] + 4) =
         (uint)(iVar36 < (int)uVar152) * iVar36 | (iVar36 >= (int)uVar152) * uVar152;
    *(uint *)(out[3] + 1) =
         (uint)(iVar36 < (int)uVar155) * iVar36 | (iVar36 >= (int)uVar155) * uVar155;
    *(uint *)((long)out[3] + 0xc) =
         (uint)(iVar36 < (int)uVar158) * iVar36 | (iVar36 >= (int)uVar158) * uVar158;
    iVar14 = iVar14 + iVar101 >> auVar10;
    iVar15 = iVar15 + iVar101 >> auVar10;
    iVar17 = iVar17 + iVar101 >> auVar10;
    iVar18 = iVar18 + iVar101 >> auVar10;
    iVar8 = iVar101 - iVar8 >> auVar10;
    iVar11 = iVar101 - iVar11 >> auVar10;
    iVar12 = iVar101 - iVar12 >> auVar10;
    iVar13 = iVar101 - iVar13 >> auVar10;
    uVar145 = (uint)(iVar14 < iVar71) * iVar71 | (uint)(iVar14 >= iVar71) * iVar14;
    uVar152 = (uint)(iVar15 < iVar71) * iVar71 | (uint)(iVar15 >= iVar71) * iVar15;
    uVar155 = (uint)(iVar17 < iVar71) * iVar71 | (uint)(iVar17 >= iVar71) * iVar17;
    uVar158 = (uint)(iVar18 < iVar71) * iVar71 | (uint)(iVar18 >= iVar71) * iVar18;
    *(uint *)out[4] = (uint)(iVar36 < (int)uVar145) * iVar36 | (iVar36 >= (int)uVar145) * uVar145;
    *(uint *)((long)out[4] + 4) =
         (uint)(iVar36 < (int)uVar152) * iVar36 | (iVar36 >= (int)uVar152) * uVar152;
    *(uint *)(out[4] + 1) =
         (uint)(iVar36 < (int)uVar155) * iVar36 | (iVar36 >= (int)uVar155) * uVar155;
    *(uint *)((long)out[4] + 0xc) =
         (uint)(iVar36 < (int)uVar158) * iVar36 | (iVar36 >= (int)uVar158) * uVar158;
    uVar145 = (uint)(iVar8 < iVar71) * iVar71 | (uint)(iVar8 >= iVar71) * iVar8;
    uVar152 = (uint)(iVar11 < iVar71) * iVar71 | (uint)(iVar11 >= iVar71) * iVar11;
    uVar155 = (uint)(iVar12 < iVar71) * iVar71 | (uint)(iVar12 >= iVar71) * iVar12;
    uVar158 = (uint)(iVar13 < iVar71) * iVar71 | (uint)(iVar13 >= iVar71) * iVar13;
    *(uint *)out[5] = (uint)(iVar36 < (int)uVar145) * iVar36 | (iVar36 >= (int)uVar145) * uVar145;
    *(uint *)((long)out[5] + 4) =
         (uint)(iVar36 < (int)uVar152) * iVar36 | (iVar36 >= (int)uVar152) * uVar152;
    *(uint *)(out[5] + 1) =
         (uint)(iVar36 < (int)uVar155) * iVar36 | (iVar36 >= (int)uVar155) * uVar155;
    *(uint *)((long)out[5] + 0xc) =
         (uint)(iVar36 < (int)uVar158) * iVar36 | (iVar36 >= (int)uVar158) * uVar158;
    iVar132 = iVar132 + iVar101 >> auVar10;
    iVar138 = iVar138 + iVar101 >> auVar10;
    iVar140 = iVar140 + iVar101 >> auVar10;
    iVar142 = iVar142 + iVar101 >> auVar10;
    uVar145 = (uint)(iVar132 < iVar71) * iVar71 | (uint)(iVar132 >= iVar71) * iVar132;
    uVar152 = (uint)(iVar138 < iVar71) * iVar71 | (uint)(iVar138 >= iVar71) * iVar138;
    uVar155 = (uint)(iVar140 < iVar71) * iVar71 | (uint)(iVar140 >= iVar71) * iVar140;
    uVar158 = (uint)(iVar142 < iVar71) * iVar71 | (uint)(iVar142 >= iVar71) * iVar142;
    *(uint *)out[6] = (uint)(iVar36 < (int)uVar145) * iVar36 | (iVar36 >= (int)uVar145) * uVar145;
    *(uint *)((long)out[6] + 4) =
         (uint)(iVar36 < (int)uVar152) * iVar36 | (iVar36 >= (int)uVar152) * uVar152;
    *(uint *)(out[6] + 1) =
         (uint)(iVar36 < (int)uVar155) * iVar36 | (iVar36 >= (int)uVar155) * uVar155;
    *(uint *)((long)out[6] + 0xc) =
         (uint)(iVar36 < (int)uVar158) * iVar36 | (iVar36 >= (int)uVar158) * uVar158;
    iVar132 = iVar101 - iVar126 >> auVar10;
    iVar138 = iVar101 - iVar129 >> auVar10;
    iVar140 = iVar101 - iVar130 >> auVar10;
    iVar142 = iVar101 - iVar131 >> auVar10;
    uVar145 = (uint)(iVar132 < iVar71) * iVar71 | (uint)(iVar132 >= iVar71) * iVar132;
    uVar152 = (uint)(iVar138 < iVar71) * iVar71 | (uint)(iVar138 >= iVar71) * iVar138;
    uVar155 = (uint)(iVar140 < iVar71) * iVar71 | (uint)(iVar140 >= iVar71) * iVar140;
    uVar158 = (uint)(iVar142 < iVar71) * iVar71 | (uint)(iVar142 >= iVar71) * iVar142;
    *(uint *)out[7] = (uint)(iVar36 < (int)uVar145) * iVar36 | (iVar36 >= (int)uVar145) * uVar145;
    *(uint *)((long)out[7] + 4) =
         (uint)(iVar36 < (int)uVar152) * iVar36 | (iVar36 >= (int)uVar152) * uVar152;
    *(uint *)(out[7] + 1) =
         (uint)(iVar36 < (int)uVar155) * iVar36 | (iVar36 >= (int)uVar155) * uVar155;
    *(uint *)((long)out[7] + 0xc) =
         (uint)(iVar36 < (int)uVar158) * iVar36 | (iVar36 >= (int)uVar158) * uVar158;
    iVar132 = iVar27 + iVar101 >> auVar10;
    iVar138 = iVar30 + iVar101 >> auVar10;
    iVar140 = iVar34 + iVar101 >> auVar10;
    iVar142 = iVar35 + iVar101 >> auVar10;
    uVar145 = (uint)(iVar132 < iVar71) * iVar71 | (uint)(iVar132 >= iVar71) * iVar132;
    uVar152 = (uint)(iVar138 < iVar71) * iVar71 | (uint)(iVar138 >= iVar71) * iVar138;
    uVar155 = (uint)(iVar140 < iVar71) * iVar71 | (uint)(iVar140 >= iVar71) * iVar140;
    uVar158 = (uint)(iVar142 < iVar71) * iVar71 | (uint)(iVar142 >= iVar71) * iVar142;
    *(uint *)out[8] = (uint)(iVar36 < (int)uVar145) * iVar36 | (iVar36 >= (int)uVar145) * uVar145;
    *(uint *)((long)out[8] + 4) =
         (uint)(iVar36 < (int)uVar152) * iVar36 | (iVar36 >= (int)uVar152) * uVar152;
    *(uint *)(out[8] + 1) =
         (uint)(iVar36 < (int)uVar155) * iVar36 | (iVar36 >= (int)uVar155) * uVar155;
    *(uint *)((long)out[8] + 0xc) =
         (uint)(iVar36 < (int)uVar158) * iVar36 | (iVar36 >= (int)uVar158) * uVar158;
    iVar132 = iVar101 - iVar4 >> auVar10;
    iVar138 = iVar101 - iVar5 >> auVar10;
    iVar140 = iVar101 - iVar6 >> auVar10;
    iVar142 = iVar101 - iVar7 >> auVar10;
    uVar145 = (uint)(iVar132 < iVar71) * iVar71 | (uint)(iVar132 >= iVar71) * iVar132;
    uVar152 = (uint)(iVar138 < iVar71) * iVar71 | (uint)(iVar138 >= iVar71) * iVar138;
    uVar155 = (uint)(iVar140 < iVar71) * iVar71 | (uint)(iVar140 >= iVar71) * iVar140;
    uVar158 = (uint)(iVar142 < iVar71) * iVar71 | (uint)(iVar142 >= iVar71) * iVar142;
    *(uint *)out[9] = (uint)(iVar36 < (int)uVar145) * iVar36 | (iVar36 >= (int)uVar145) * uVar145;
    *(uint *)((long)out[9] + 4) =
         (uint)(iVar36 < (int)uVar152) * iVar36 | (iVar36 >= (int)uVar152) * uVar152;
    *(uint *)(out[9] + 1) =
         (uint)(iVar36 < (int)uVar155) * iVar36 | (iVar36 >= (int)uVar155) * uVar155;
    *(uint *)((long)out[9] + 0xc) =
         (uint)(iVar36 < (int)uVar158) * iVar36 | (iVar36 >= (int)uVar158) * uVar158;
    iVar132 = iVar19 + iVar101 >> auVar10;
    iVar138 = iVar20 + iVar101 >> auVar10;
    iVar140 = iVar21 + iVar101 >> auVar10;
    iVar142 = iVar3 + iVar101 >> auVar10;
    uVar145 = (uint)(iVar132 < iVar71) * iVar71 | (uint)(iVar132 >= iVar71) * iVar132;
    uVar152 = (uint)(iVar138 < iVar71) * iVar71 | (uint)(iVar138 >= iVar71) * iVar138;
    uVar155 = (uint)(iVar140 < iVar71) * iVar71 | (uint)(iVar140 >= iVar71) * iVar140;
    uVar158 = (uint)(iVar142 < iVar71) * iVar71 | (uint)(iVar142 >= iVar71) * iVar142;
    *(uint *)out[10] = (uint)(iVar36 < (int)uVar145) * iVar36 | (iVar36 >= (int)uVar145) * uVar145;
    *(uint *)((long)out[10] + 4) =
         (uint)(iVar36 < (int)uVar152) * iVar36 | (iVar36 >= (int)uVar152) * uVar152;
    *(uint *)(out[10] + 1) =
         (uint)(iVar36 < (int)uVar155) * iVar36 | (iVar36 >= (int)uVar155) * uVar155;
    *(uint *)((long)out[10] + 0xc) =
         (uint)(iVar36 < (int)uVar158) * iVar36 | (iVar36 >= (int)uVar158) * uVar158;
    iVar132 = iVar101 - iVar23 >> auVar10;
    iVar138 = iVar101 - iVar24 >> auVar10;
    iVar140 = iVar101 - iVar25 >> auVar10;
    iVar142 = iVar101 - iVar26 >> auVar10;
    uVar145 = (uint)(iVar132 < iVar71) * iVar71 | (uint)(iVar132 >= iVar71) * iVar132;
    uVar152 = (uint)(iVar138 < iVar71) * iVar71 | (uint)(iVar138 >= iVar71) * iVar138;
    uVar155 = (uint)(iVar140 < iVar71) * iVar71 | (uint)(iVar140 >= iVar71) * iVar140;
    uVar158 = (uint)(iVar142 < iVar71) * iVar71 | (uint)(iVar142 >= iVar71) * iVar142;
    *(uint *)out[0xb] = (uint)(iVar36 < (int)uVar145) * iVar36 | (iVar36 >= (int)uVar145) * uVar145;
    *(uint *)((long)out[0xb] + 4) =
         (uint)(iVar36 < (int)uVar152) * iVar36 | (iVar36 >= (int)uVar152) * uVar152;
    *(uint *)(out[0xb] + 1) =
         (uint)(iVar36 < (int)uVar155) * iVar36 | (iVar36 >= (int)uVar155) * uVar155;
    *(uint *)((long)out[0xb] + 0xc) =
         (uint)(iVar36 < (int)uVar158) * iVar36 | (iVar36 >= (int)uVar158) * uVar158;
    iVar3 = (int)(uVar37 + iVar101) >> auVar10;
    iVar126 = (int)(uVar40 + iVar101) >> auVar10;
    iVar129 = (int)((uint)uStack_f0 + iVar101) >> auVar10;
    iVar130 = (int)(uStack_f0._4_4_ + iVar101) >> auVar10;
    iVar132 = (int)(iVar101 - uVar55) >> auVar10;
    iVar138 = (int)(iVar101 - uVar60) >> auVar10;
    iVar140 = (int)(iVar101 - uVar62) >> auVar10;
    iVar142 = (int)(iVar101 - uVar64) >> auVar10;
    uVar145 = (uint)(iVar3 < iVar71) * iVar71 | (uint)(iVar3 >= iVar71) * iVar3;
    uVar152 = (uint)(iVar126 < iVar71) * iVar71 | (uint)(iVar126 >= iVar71) * iVar126;
    uVar155 = (uint)(iVar129 < iVar71) * iVar71 | (uint)(iVar129 >= iVar71) * iVar129;
    uVar158 = (uint)(iVar130 < iVar71) * iVar71 | (uint)(iVar130 >= iVar71) * iVar130;
    *(uint *)out[0xc] = (uint)(iVar36 < (int)uVar145) * iVar36 | (iVar36 >= (int)uVar145) * uVar145;
    *(uint *)((long)out[0xc] + 4) =
         (uint)(iVar36 < (int)uVar152) * iVar36 | (iVar36 >= (int)uVar152) * uVar152;
    *(uint *)(out[0xc] + 1) =
         (uint)(iVar36 < (int)uVar155) * iVar36 | (iVar36 >= (int)uVar155) * uVar155;
    *(uint *)((long)out[0xc] + 0xc) =
         (uint)(iVar36 < (int)uVar158) * iVar36 | (iVar36 >= (int)uVar158) * uVar158;
    uVar145 = (uint)(iVar132 < iVar71) * iVar71 | (uint)(iVar132 >= iVar71) * iVar132;
    uVar152 = (uint)(iVar138 < iVar71) * iVar71 | (uint)(iVar138 >= iVar71) * iVar138;
    uVar155 = (uint)(iVar140 < iVar71) * iVar71 | (uint)(iVar140 >= iVar71) * iVar140;
    uVar158 = (uint)(iVar142 < iVar71) * iVar71 | (uint)(iVar142 >= iVar71) * iVar142;
    *(uint *)out[0xd] = (uint)(iVar36 < (int)uVar145) * iVar36 | (iVar36 >= (int)uVar145) * uVar145;
    *(uint *)((long)out[0xd] + 4) =
         (uint)(iVar36 < (int)uVar152) * iVar36 | (iVar36 >= (int)uVar152) * uVar152;
    *(uint *)(out[0xd] + 1) =
         (uint)(iVar36 < (int)uVar155) * iVar36 | (iVar36 >= (int)uVar155) * uVar155;
    *(uint *)((long)out[0xd] + 0xc) =
         (uint)(iVar36 < (int)uVar158) * iVar36 | (iVar36 >= (int)uVar158) * uVar158;
    iVar132 = (int)(uVar84 + iVar101) >> auVar10;
    iVar138 = (int)(uVar89 + iVar101) >> auVar10;
    iVar140 = (int)(uVar91 + iVar101) >> auVar10;
    iVar142 = (int)(uVar93 + iVar101) >> auVar10;
    iVar3 = (int)(iVar101 - uVar72) >> auVar10;
    iVar126 = (int)(iVar101 - uVar78) >> auVar10;
    iVar129 = (int)(iVar101 - uVar80) >> auVar10;
    iVar130 = (int)(iVar101 - uVar82) >> auVar10;
    uVar145 = (uint)(iVar132 < iVar71) * iVar71 | (uint)(iVar132 >= iVar71) * iVar132;
    uVar152 = (uint)(iVar138 < iVar71) * iVar71 | (uint)(iVar138 >= iVar71) * iVar138;
    uVar155 = (uint)(iVar140 < iVar71) * iVar71 | (uint)(iVar140 >= iVar71) * iVar140;
    uVar158 = (uint)(iVar142 < iVar71) * iVar71 | (uint)(iVar142 >= iVar71) * iVar142;
    uVar161 = (uint)(iVar3 < iVar71) * iVar71 | (uint)(iVar3 >= iVar71) * iVar3;
    uVar171 = (uint)(iVar126 < iVar71) * iVar71 | (uint)(iVar126 >= iVar71) * iVar126;
    uVar175 = (uint)(iVar129 < iVar71) * iVar71 | (uint)(iVar129 >= iVar71) * iVar129;
    uVar179 = (uint)(iVar130 < iVar71) * iVar71 | (uint)(iVar130 >= iVar71) * iVar130;
    *(uint *)out[0xe] = (uint)(iVar36 < (int)uVar145) * iVar36 | (iVar36 >= (int)uVar145) * uVar145;
    *(uint *)((long)out[0xe] + 4) =
         (uint)(iVar36 < (int)uVar152) * iVar36 | (iVar36 >= (int)uVar152) * uVar152;
    *(uint *)(out[0xe] + 1) =
         (uint)(iVar36 < (int)uVar155) * iVar36 | (iVar36 >= (int)uVar155) * uVar155;
    *(uint *)((long)out[0xe] + 0xc) =
         (uint)(iVar36 < (int)uVar158) * iVar36 | (iVar36 >= (int)uVar158) * uVar158;
    *(uint *)out[0xf] = (uint)(iVar36 < (int)uVar161) * iVar36 | (iVar36 >= (int)uVar161) * uVar161;
    *(uint *)((long)out[0xf] + 4) =
         (uint)(iVar36 < (int)uVar171) * iVar36 | (iVar36 >= (int)uVar171) * uVar171;
    *(uint *)(out[0xf] + 1) =
         (uint)(iVar36 < (int)uVar175) * iVar36 | (iVar36 >= (int)uVar175) * uVar175;
    *(uint *)((long)out[0xf] + 0xc) =
         (uint)(iVar36 < (int)uVar179) * iVar36 | (iVar36 >= (int)uVar179) * uVar179;
  }
  else {
    (*out)[0] = CONCAT44(uVar50,uVar43);
    (*out)[1] = CONCAT44(uVar54,uVar52);
    *(uint *)out[1] = -uVar161;
    *(uint *)((long)out[1] + 4) = -uVar171;
    *(uint *)(out[1] + 1) = -uVar175;
    *(uint *)((long)out[1] + 0xc) = -uVar179;
    *(uint *)out[2] = uVar41;
    *(uint *)((long)out[2] + 4) = uVar42;
    *(uint *)(out[2] + 1) = uVar66;
    *(uint *)((long)out[2] + 0xc) = uVar68;
    *(uint *)out[3] = -uVar145;
    *(uint *)((long)out[3] + 4) = -uVar152;
    *(uint *)(out[3] + 1) = -uVar155;
    *(uint *)((long)out[3] + 0xc) = -uVar158;
    *(int *)out[4] = iVar14;
    *(int *)((long)out[4] + 4) = iVar15;
    *(int *)(out[4] + 1) = iVar17;
    *(int *)((long)out[4] + 0xc) = iVar18;
    *(int *)out[5] = -iVar8;
    *(int *)((long)out[5] + 4) = -iVar11;
    *(int *)(out[5] + 1) = -iVar12;
    *(int *)((long)out[5] + 0xc) = -iVar13;
    *(int *)out[6] = iVar132;
    *(int *)((long)out[6] + 4) = iVar138;
    *(int *)(out[6] + 1) = iVar140;
    *(int *)((long)out[6] + 0xc) = iVar142;
    *(int *)out[7] = -iVar126;
    *(int *)((long)out[7] + 4) = -iVar129;
    *(int *)(out[7] + 1) = -iVar130;
    *(int *)((long)out[7] + 0xc) = -iVar131;
    *(int *)out[8] = iVar27;
    *(int *)((long)out[8] + 4) = iVar30;
    *(int *)(out[8] + 1) = iVar34;
    *(int *)((long)out[8] + 0xc) = iVar35;
    *(int *)out[9] = -iVar4;
    *(int *)((long)out[9] + 4) = -iVar5;
    *(int *)(out[9] + 1) = -iVar6;
    *(int *)((long)out[9] + 0xc) = -iVar7;
    *(int *)out[10] = iVar19;
    *(int *)((long)out[10] + 4) = iVar20;
    *(int *)(out[10] + 1) = iVar21;
    *(int *)((long)out[10] + 0xc) = iVar3;
    *(int *)out[0xb] = -iVar23;
    *(int *)((long)out[0xb] + 4) = -iVar24;
    *(int *)(out[0xb] + 1) = -iVar25;
    *(int *)((long)out[0xb] + 0xc) = -iVar26;
    out[0xc][0] = local_f8;
    out[0xc][1] = uStack_f0;
    *(uint *)out[0xd] = -uVar55;
    *(uint *)((long)out[0xd] + 4) = -uVar60;
    *(uint *)(out[0xd] + 1) = -uVar62;
    *(uint *)((long)out[0xd] + 0xc) = -uVar64;
    out[0xe][0] = CONCAT44(uVar89,uVar84);
    out[0xe][1] = CONCAT44(uVar93,uVar91);
    *(uint *)out[0xf] = -uVar72;
    *(uint *)((long)out[0xf] + 4) = -uVar78;
    *(uint *)(out[0xf] + 1) = -uVar80;
    *(uint *)((long)out[0xf] + 0xc) = -uVar82;
  }
  return;
}

Assistant:

static void iadst16x16_low8_sse4_1(__m128i *in, __m128i *out, int bit,
                                   int do_cols, int bd, int out_shift) {
  const int32_t *cospi = cospi_arr(bit);
  const __m128i cospi2 = _mm_set1_epi32(cospi[2]);
  const __m128i cospi62 = _mm_set1_epi32(cospi[62]);
  const __m128i cospi10 = _mm_set1_epi32(cospi[10]);
  const __m128i cospi54 = _mm_set1_epi32(cospi[54]);
  const __m128i cospi18 = _mm_set1_epi32(cospi[18]);
  const __m128i cospi46 = _mm_set1_epi32(cospi[46]);
  const __m128i cospi26 = _mm_set1_epi32(cospi[26]);
  const __m128i cospi38 = _mm_set1_epi32(cospi[38]);
  const __m128i cospi34 = _mm_set1_epi32(cospi[34]);
  const __m128i cospi30 = _mm_set1_epi32(cospi[30]);
  const __m128i cospi42 = _mm_set1_epi32(cospi[42]);
  const __m128i cospi22 = _mm_set1_epi32(cospi[22]);
  const __m128i cospi50 = _mm_set1_epi32(cospi[50]);
  const __m128i cospi14 = _mm_set1_epi32(cospi[14]);
  const __m128i cospi58 = _mm_set1_epi32(cospi[58]);
  const __m128i cospi6 = _mm_set1_epi32(cospi[6]);
  const __m128i cospi8 = _mm_set1_epi32(cospi[8]);
  const __m128i cospi56 = _mm_set1_epi32(cospi[56]);
  const __m128i cospi40 = _mm_set1_epi32(cospi[40]);
  const __m128i cospi24 = _mm_set1_epi32(cospi[24]);
  const __m128i cospim56 = _mm_set1_epi32(-cospi[56]);
  const __m128i cospim24 = _mm_set1_epi32(-cospi[24]);
  const __m128i cospi48 = _mm_set1_epi32(cospi[48]);
  const __m128i cospi16 = _mm_set1_epi32(cospi[16]);
  const __m128i cospim48 = _mm_set1_epi32(-cospi[48]);
  const __m128i cospi32 = _mm_set1_epi32(cospi[32]);
  const __m128i rnding = _mm_set1_epi32(1 << (bit - 1));
  const int log_range = AOMMAX(16, bd + (do_cols ? 6 : 8));
  const __m128i clamp_lo = _mm_set1_epi32(-(1 << (log_range - 1)));
  const __m128i clamp_hi = _mm_set1_epi32((1 << (log_range - 1)) - 1);
  __m128i zero = _mm_setzero_si128();
  __m128i u[16], x, y;

  // stage 0
  // stage 1
  // stage 2
  x = _mm_mullo_epi32(in[0], cospi62);
  u[0] = _mm_add_epi32(x, rnding);
  u[0] = _mm_srai_epi32(u[0], bit);

  x = _mm_mullo_epi32(in[0], cospi2);
  u[1] = _mm_sub_epi32(zero, x);
  u[1] = _mm_add_epi32(u[1], rnding);
  u[1] = _mm_srai_epi32(u[1], bit);

  x = _mm_mullo_epi32(in[2], cospi54);
  u[2] = _mm_add_epi32(x, rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  x = _mm_mullo_epi32(in[2], cospi10);
  u[3] = _mm_sub_epi32(zero, x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);

  x = _mm_mullo_epi32(in[4], cospi46);
  u[4] = _mm_add_epi32(x, rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  x = _mm_mullo_epi32(in[4], cospi18);
  u[5] = _mm_sub_epi32(zero, x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  x = _mm_mullo_epi32(in[6], cospi38);
  u[6] = _mm_add_epi32(x, rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  x = _mm_mullo_epi32(in[6], cospi26);
  u[7] = _mm_sub_epi32(zero, x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  u[8] = _mm_mullo_epi32(in[7], cospi34);
  u[8] = _mm_add_epi32(u[8], rnding);
  u[8] = _mm_srai_epi32(u[8], bit);

  u[9] = _mm_mullo_epi32(in[7], cospi30);
  u[9] = _mm_add_epi32(u[9], rnding);
  u[9] = _mm_srai_epi32(u[9], bit);

  u[10] = _mm_mullo_epi32(in[5], cospi42);
  u[10] = _mm_add_epi32(u[10], rnding);
  u[10] = _mm_srai_epi32(u[10], bit);

  u[11] = _mm_mullo_epi32(in[5], cospi22);
  u[11] = _mm_add_epi32(u[11], rnding);
  u[11] = _mm_srai_epi32(u[11], bit);

  u[12] = _mm_mullo_epi32(in[3], cospi50);
  u[12] = _mm_add_epi32(u[12], rnding);
  u[12] = _mm_srai_epi32(u[12], bit);

  u[13] = _mm_mullo_epi32(in[3], cospi14);
  u[13] = _mm_add_epi32(u[13], rnding);
  u[13] = _mm_srai_epi32(u[13], bit);

  u[14] = _mm_mullo_epi32(in[1], cospi58);
  u[14] = _mm_add_epi32(u[14], rnding);
  u[14] = _mm_srai_epi32(u[14], bit);

  u[15] = _mm_mullo_epi32(in[1], cospi6);
  u[15] = _mm_add_epi32(u[15], rnding);
  u[15] = _mm_srai_epi32(u[15], bit);

  // stage 3
  addsub_sse4_1(u[0], u[8], &u[0], &u[8], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[9], &u[1], &u[9], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[10], &u[2], &u[10], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[11], &u[3], &u[11], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[12], &u[4], &u[12], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[13], &u[5], &u[13], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[6], u[14], &u[6], &u[14], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[7], u[15], &u[7], &u[15], &clamp_lo, &clamp_hi);

  // stage 4
  y = _mm_mullo_epi32(u[8], cospi56);
  x = _mm_mullo_epi32(u[9], cospi56);
  u[8] = _mm_mullo_epi32(u[8], cospi8);
  u[8] = _mm_add_epi32(u[8], x);
  u[8] = _mm_add_epi32(u[8], rnding);
  u[8] = _mm_srai_epi32(u[8], bit);

  x = _mm_mullo_epi32(u[9], cospi8);
  u[9] = _mm_sub_epi32(y, x);
  u[9] = _mm_add_epi32(u[9], rnding);
  u[9] = _mm_srai_epi32(u[9], bit);

  x = _mm_mullo_epi32(u[11], cospi24);
  y = _mm_mullo_epi32(u[10], cospi24);
  u[10] = _mm_mullo_epi32(u[10], cospi40);
  u[10] = _mm_add_epi32(u[10], x);
  u[10] = _mm_add_epi32(u[10], rnding);
  u[10] = _mm_srai_epi32(u[10], bit);

  x = _mm_mullo_epi32(u[11], cospi40);
  u[11] = _mm_sub_epi32(y, x);
  u[11] = _mm_add_epi32(u[11], rnding);
  u[11] = _mm_srai_epi32(u[11], bit);

  x = _mm_mullo_epi32(u[13], cospi8);
  y = _mm_mullo_epi32(u[12], cospi8);
  u[12] = _mm_mullo_epi32(u[12], cospim56);
  u[12] = _mm_add_epi32(u[12], x);
  u[12] = _mm_add_epi32(u[12], rnding);
  u[12] = _mm_srai_epi32(u[12], bit);

  x = _mm_mullo_epi32(u[13], cospim56);
  u[13] = _mm_sub_epi32(y, x);
  u[13] = _mm_add_epi32(u[13], rnding);
  u[13] = _mm_srai_epi32(u[13], bit);

  x = _mm_mullo_epi32(u[15], cospi40);
  y = _mm_mullo_epi32(u[14], cospi40);
  u[14] = _mm_mullo_epi32(u[14], cospim24);
  u[14] = _mm_add_epi32(u[14], x);
  u[14] = _mm_add_epi32(u[14], rnding);
  u[14] = _mm_srai_epi32(u[14], bit);

  x = _mm_mullo_epi32(u[15], cospim24);
  u[15] = _mm_sub_epi32(y, x);
  u[15] = _mm_add_epi32(u[15], rnding);
  u[15] = _mm_srai_epi32(u[15], bit);

  // stage 5
  addsub_sse4_1(u[0], u[4], &u[0], &u[4], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[5], &u[1], &u[5], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[2], u[6], &u[2], &u[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[3], u[7], &u[3], &u[7], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[8], u[12], &u[8], &u[12], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[9], u[13], &u[9], &u[13], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[10], u[14], &u[10], &u[14], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[11], u[15], &u[11], &u[15], &clamp_lo, &clamp_hi);

  // stage 6
  x = _mm_mullo_epi32(u[5], cospi48);
  y = _mm_mullo_epi32(u[4], cospi48);
  u[4] = _mm_mullo_epi32(u[4], cospi16);
  u[4] = _mm_add_epi32(u[4], x);
  u[4] = _mm_add_epi32(u[4], rnding);
  u[4] = _mm_srai_epi32(u[4], bit);

  x = _mm_mullo_epi32(u[5], cospi16);
  u[5] = _mm_sub_epi32(y, x);
  u[5] = _mm_add_epi32(u[5], rnding);
  u[5] = _mm_srai_epi32(u[5], bit);

  x = _mm_mullo_epi32(u[7], cospi16);
  y = _mm_mullo_epi32(u[6], cospi16);
  u[6] = _mm_mullo_epi32(u[6], cospim48);
  u[6] = _mm_add_epi32(u[6], x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  x = _mm_mullo_epi32(u[7], cospim48);
  u[7] = _mm_sub_epi32(y, x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  x = _mm_mullo_epi32(u[13], cospi48);
  y = _mm_mullo_epi32(u[12], cospi48);
  u[12] = _mm_mullo_epi32(u[12], cospi16);
  u[12] = _mm_add_epi32(u[12], x);
  u[12] = _mm_add_epi32(u[12], rnding);
  u[12] = _mm_srai_epi32(u[12], bit);

  x = _mm_mullo_epi32(u[13], cospi16);
  u[13] = _mm_sub_epi32(y, x);
  u[13] = _mm_add_epi32(u[13], rnding);
  u[13] = _mm_srai_epi32(u[13], bit);

  x = _mm_mullo_epi32(u[15], cospi16);
  y = _mm_mullo_epi32(u[14], cospi16);
  u[14] = _mm_mullo_epi32(u[14], cospim48);
  u[14] = _mm_add_epi32(u[14], x);
  u[14] = _mm_add_epi32(u[14], rnding);
  u[14] = _mm_srai_epi32(u[14], bit);

  x = _mm_mullo_epi32(u[15], cospim48);
  u[15] = _mm_sub_epi32(y, x);
  u[15] = _mm_add_epi32(u[15], rnding);
  u[15] = _mm_srai_epi32(u[15], bit);

  // stage 7
  addsub_sse4_1(u[0], u[2], &u[0], &u[2], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[1], u[3], &u[1], &u[3], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[4], u[6], &u[4], &u[6], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[5], u[7], &u[5], &u[7], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[8], u[10], &u[8], &u[10], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[9], u[11], &u[9], &u[11], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[12], u[14], &u[12], &u[14], &clamp_lo, &clamp_hi);
  addsub_sse4_1(u[13], u[15], &u[13], &u[15], &clamp_lo, &clamp_hi);

  // stage 8
  y = _mm_mullo_epi32(u[2], cospi32);
  x = _mm_mullo_epi32(u[3], cospi32);
  u[2] = _mm_add_epi32(y, x);
  u[2] = _mm_add_epi32(u[2], rnding);
  u[2] = _mm_srai_epi32(u[2], bit);

  u[3] = _mm_sub_epi32(y, x);
  u[3] = _mm_add_epi32(u[3], rnding);
  u[3] = _mm_srai_epi32(u[3], bit);
  y = _mm_mullo_epi32(u[6], cospi32);
  x = _mm_mullo_epi32(u[7], cospi32);
  u[6] = _mm_add_epi32(y, x);
  u[6] = _mm_add_epi32(u[6], rnding);
  u[6] = _mm_srai_epi32(u[6], bit);

  u[7] = _mm_sub_epi32(y, x);
  u[7] = _mm_add_epi32(u[7], rnding);
  u[7] = _mm_srai_epi32(u[7], bit);

  y = _mm_mullo_epi32(u[10], cospi32);
  x = _mm_mullo_epi32(u[11], cospi32);
  u[10] = _mm_add_epi32(y, x);
  u[10] = _mm_add_epi32(u[10], rnding);
  u[10] = _mm_srai_epi32(u[10], bit);

  u[11] = _mm_sub_epi32(y, x);
  u[11] = _mm_add_epi32(u[11], rnding);
  u[11] = _mm_srai_epi32(u[11], bit);

  y = _mm_mullo_epi32(u[14], cospi32);
  x = _mm_mullo_epi32(u[15], cospi32);
  u[14] = _mm_add_epi32(y, x);
  u[14] = _mm_add_epi32(u[14], rnding);
  u[14] = _mm_srai_epi32(u[14], bit);

  u[15] = _mm_sub_epi32(y, x);
  u[15] = _mm_add_epi32(u[15], rnding);
  u[15] = _mm_srai_epi32(u[15], bit);

  // stage 9
  if (do_cols) {
    out[0] = u[0];
    out[1] = _mm_sub_epi32(zero, u[8]);
    out[2] = u[12];
    out[3] = _mm_sub_epi32(zero, u[4]);
    out[4] = u[6];
    out[5] = _mm_sub_epi32(zero, u[14]);
    out[6] = u[10];
    out[7] = _mm_sub_epi32(zero, u[2]);
    out[8] = u[3];
    out[9] = _mm_sub_epi32(zero, u[11]);
    out[10] = u[15];
    out[11] = _mm_sub_epi32(zero, u[7]);
    out[12] = u[5];
    out[13] = _mm_sub_epi32(zero, u[13]);
    out[14] = u[9];
    out[15] = _mm_sub_epi32(zero, u[1]);
  } else {
    const int log_range_out = AOMMAX(16, bd + 6);
    const __m128i clamp_lo_out = _mm_set1_epi32(-(1 << (log_range_out - 1)));
    const __m128i clamp_hi_out = _mm_set1_epi32((1 << (log_range_out - 1)) - 1);

    neg_shift_sse4_1(u[0], u[8], out + 0, out + 1, &clamp_lo_out, &clamp_hi_out,
                     out_shift);
    neg_shift_sse4_1(u[12], u[4], out + 2, out + 3, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[6], u[14], out + 4, out + 5, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[10], u[2], out + 6, out + 7, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[3], u[11], out + 8, out + 9, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[15], u[7], out + 10, out + 11, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[5], u[13], out + 12, out + 13, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
    neg_shift_sse4_1(u[9], u[1], out + 14, out + 15, &clamp_lo_out,
                     &clamp_hi_out, out_shift);
  }
}